

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  ulong uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 in_R9;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar85;
  float fVar87;
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar86;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vint4 ai;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar148;
  float fVar163;
  float fVar164;
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar165;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vfloat4 a0_2;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar220;
  vfloat4 a0_3;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  vfloat4 a0;
  undefined1 auVar241 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar248;
  float fVar256;
  float fVar257;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar258;
  undefined1 auVar255 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_51c;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  ulong local_398;
  Primitive *local_390;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 auStack_378 [16];
  undefined1 local_368 [32];
  RTCFilterFunctionNArguments local_348;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 auStack_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar49;
  undefined1 auVar270 [32];
  
  PVar4 = prim[1];
  uVar48 = (ulong)(byte)PVar4;
  fVar59 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar166._0_4_ = fVar59 * (ray->dir).field_0.m128[0];
  auVar166._4_4_ = fVar59 * (ray->dir).field_0.m128[1];
  auVar166._8_4_ = fVar59 * (ray->dir).field_0.m128[2];
  auVar166._12_4_ = fVar59 * (ray->dir).field_0.m128[3];
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar61._0_4_ = fVar59 * auVar12._0_4_;
  auVar61._4_4_ = fVar59 * auVar12._4_4_;
  auVar61._8_4_ = fVar59 * auVar12._8_4_;
  auVar61._12_4_ = fVar59 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar241 = vcvtdq2ps_avx(auVar241);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar259._4_4_ = auVar166._0_4_;
  auVar259._0_4_ = auVar166._0_4_;
  auVar259._8_4_ = auVar166._0_4_;
  auVar259._12_4_ = auVar166._0_4_;
  auVar108 = vshufps_avx(auVar166,auVar166,0x55);
  auVar127 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar59 = auVar127._0_4_;
  auVar221._0_4_ = fVar59 * auVar130._0_4_;
  fVar85 = auVar127._4_4_;
  auVar221._4_4_ = fVar85 * auVar130._4_4_;
  fVar122 = auVar127._8_4_;
  auVar221._8_4_ = fVar122 * auVar130._8_4_;
  fVar86 = auVar127._12_4_;
  auVar221._12_4_ = fVar86 * auVar130._12_4_;
  auVar206._0_4_ = auVar155._0_4_ * fVar59;
  auVar206._4_4_ = auVar155._4_4_ * fVar85;
  auVar206._8_4_ = auVar155._8_4_ * fVar122;
  auVar206._12_4_ = auVar155._12_4_ * fVar86;
  auVar198._0_4_ = auVar90._0_4_ * fVar59;
  auVar198._4_4_ = auVar90._4_4_ * fVar85;
  auVar198._8_4_ = auVar90._8_4_ * fVar122;
  auVar198._12_4_ = auVar90._12_4_ * fVar86;
  auVar127 = vfmadd231ps_fma(auVar221,auVar108,auVar12);
  auVar91 = vfmadd231ps_fma(auVar206,auVar108,auVar241);
  auVar108 = vfmadd231ps_fma(auVar198,auVar235,auVar108);
  auVar123 = vfmadd231ps_fma(auVar127,auVar259,auVar10);
  auVar91 = vfmadd231ps_fma(auVar91,auVar259,auVar11);
  auVar136 = vfmadd231ps_fma(auVar108,auVar62,auVar259);
  auVar260._4_4_ = auVar61._0_4_;
  auVar260._0_4_ = auVar61._0_4_;
  auVar260._8_4_ = auVar61._0_4_;
  auVar260._12_4_ = auVar61._0_4_;
  auVar108 = vshufps_avx(auVar61,auVar61,0x55);
  auVar127 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar59 = auVar127._0_4_;
  auVar167._0_4_ = fVar59 * auVar130._0_4_;
  fVar85 = auVar127._4_4_;
  auVar167._4_4_ = fVar85 * auVar130._4_4_;
  fVar122 = auVar127._8_4_;
  auVar167._8_4_ = fVar122 * auVar130._8_4_;
  fVar86 = auVar127._12_4_;
  auVar167._12_4_ = fVar86 * auVar130._12_4_;
  auVar89._0_4_ = auVar155._0_4_ * fVar59;
  auVar89._4_4_ = auVar155._4_4_ * fVar85;
  auVar89._8_4_ = auVar155._8_4_ * fVar122;
  auVar89._12_4_ = auVar155._12_4_ * fVar86;
  auVar127._0_4_ = auVar90._0_4_ * fVar59;
  auVar127._4_4_ = auVar90._4_4_ * fVar85;
  auVar127._8_4_ = auVar90._8_4_ * fVar122;
  auVar127._12_4_ = auVar90._12_4_ * fVar86;
  auVar12 = vfmadd231ps_fma(auVar167,auVar108,auVar12);
  auVar130 = vfmadd231ps_fma(auVar89,auVar108,auVar241);
  auVar241 = vfmadd231ps_fma(auVar127,auVar108,auVar235);
  auVar235 = vfmadd231ps_fma(auVar12,auVar260,auVar10);
  auVar90 = vfmadd231ps_fma(auVar130,auVar260,auVar11);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar123,local_318);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar183,1);
  auVar12 = vblendvps_avx(auVar123,auVar183,auVar10);
  auVar10 = vandps_avx(auVar91,local_318);
  auVar10 = vcmpps_avx(auVar10,auVar183,1);
  auVar130 = vblendvps_avx(auVar91,auVar183,auVar10);
  auVar10 = vandps_avx(auVar136,local_318);
  auVar10 = vcmpps_avx(auVar10,auVar183,1);
  auVar10 = vblendvps_avx(auVar136,auVar183,auVar10);
  auVar108 = vfmadd231ps_fma(auVar241,auVar260,auVar62);
  auVar11 = vrcpps_avx(auVar12);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar11,auVar184);
  auVar11 = vfmadd132ps_fma(auVar12,auVar11,auVar11);
  auVar12 = vrcpps_avx(auVar130);
  auVar130 = vfnmadd213ps_fma(auVar130,auVar12,auVar184);
  auVar155 = vfmadd132ps_fma(auVar130,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar184);
  auVar62 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar10 = vpmovsxwd_avx(auVar10);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar235);
  auVar136._0_4_ = auVar11._0_4_ * auVar10._0_4_;
  auVar136._4_4_ = auVar11._4_4_ * auVar10._4_4_;
  auVar136._8_4_ = auVar11._8_4_ * auVar10._8_4_;
  auVar136._12_4_ = auVar11._12_4_ * auVar10._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar10 = vpmovsxwd_avx(auVar12);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar235);
  auVar149._0_4_ = auVar11._0_4_ * auVar10._0_4_;
  auVar149._4_4_ = auVar11._4_4_ * auVar10._4_4_;
  auVar149._8_4_ = auVar11._8_4_ * auVar10._8_4_;
  auVar149._12_4_ = auVar11._12_4_ * auVar10._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar10 = vpmovsxwd_avx(auVar130);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar90);
  auVar168._0_4_ = auVar155._0_4_ * auVar10._0_4_;
  auVar168._4_4_ = auVar155._4_4_ * auVar10._4_4_;
  auVar168._8_4_ = auVar155._8_4_ * auVar10._8_4_;
  auVar168._12_4_ = auVar155._12_4_ * auVar10._12_4_;
  auVar91._1_3_ = 0;
  auVar91[0] = PVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar12 = vsubps_avx(auVar10,auVar90);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar10 = vpmovsxwd_avx(auVar241);
  auVar90._0_4_ = auVar155._0_4_ * auVar12._0_4_;
  auVar90._4_4_ = auVar155._4_4_ * auVar12._4_4_;
  auVar90._8_4_ = auVar155._8_4_ * auVar12._8_4_;
  auVar90._12_4_ = auVar155._12_4_ * auVar12._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar108);
  auVar123._0_4_ = auVar62._0_4_ * auVar10._0_4_;
  auVar123._4_4_ = auVar62._4_4_ * auVar10._4_4_;
  auVar123._8_4_ = auVar62._8_4_ * auVar10._8_4_;
  auVar123._12_4_ = auVar62._12_4_ * auVar10._12_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar10 = vpmovsxwd_avx(auVar155);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar108);
  auVar235._0_4_ = auVar62._0_4_ * auVar10._0_4_;
  auVar235._4_4_ = auVar62._4_4_ * auVar10._4_4_;
  auVar235._8_4_ = auVar62._8_4_ * auVar10._8_4_;
  auVar235._12_4_ = auVar62._12_4_ * auVar10._12_4_;
  auVar10 = vpminsd_avx(auVar136,auVar149);
  auVar12 = vpminsd_avx(auVar168,auVar90);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vpminsd_avx(auVar123,auVar235);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar207._4_4_ = uVar57;
  auVar207._0_4_ = uVar57;
  auVar207._8_4_ = uVar57;
  auVar207._12_4_ = uVar57;
  auVar12 = vmaxps_avx(auVar12,auVar207);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  local_248._0_4_ = auVar10._0_4_ * 0.99999964;
  local_248._4_4_ = auVar10._4_4_ * 0.99999964;
  local_248._8_4_ = auVar10._8_4_ * 0.99999964;
  local_248._12_4_ = auVar10._12_4_ * 0.99999964;
  auVar10 = vpmaxsd_avx(auVar136,auVar149);
  auVar12 = vpmaxsd_avx(auVar168,auVar90);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar12 = vpmaxsd_avx(auVar123,auVar235);
  fVar59 = ray->tfar;
  auVar108._4_4_ = fVar59;
  auVar108._0_4_ = fVar59;
  auVar108._8_4_ = fVar59;
  auVar108._12_4_ = fVar59;
  auVar12 = vminps_avx(auVar12,auVar108);
  auVar10 = vminps_avx(auVar10,auVar12);
  auVar62._0_4_ = auVar10._0_4_ * 1.0000004;
  auVar62._4_4_ = auVar10._4_4_ * 1.0000004;
  auVar62._8_4_ = auVar10._8_4_ * 1.0000004;
  auVar62._12_4_ = auVar10._12_4_ * 1.0000004;
  auVar91[4] = PVar4;
  auVar91._5_3_ = 0;
  auVar91[8] = PVar4;
  auVar91._9_3_ = 0;
  auVar91[0xc] = PVar4;
  auVar91._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar91,_DAT_01f4ad30);
  auVar10 = vcmpps_avx(local_248,auVar62,2);
  auVar10 = vandps_avx(auVar10,auVar12);
  uVar57 = vmovmskps_avx(auVar10);
  uVar48 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar57);
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_390 = prim;
LAB_01182e5d:
  if (uVar48 == 0) {
LAB_0118497d:
    return uVar48 != 0;
  }
  lVar50 = 0;
  for (uVar54 = uVar48; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  local_4c0 = (ulong)*(uint *)(local_390 + 2);
  local_398 = (ulong)*(uint *)(local_390 + lVar50 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_4c0].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_398);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar10 = *(undefined1 (*) [16])(_Var8 + uVar53 * (long)pvVar7);
  auVar12 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 1) * (long)pvVar7);
  auVar130 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar53 + 3));
  fVar59 = *pfVar1;
  fVar85 = pfVar1[1];
  fVar122 = pfVar1[2];
  fVar86 = pfVar1[3];
  lVar50 = *(long *)&pGVar5[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar53);
  auVar241 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar53 + 1));
  auVar155 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar53 + 2));
  uVar54 = uVar48 - 1 & uVar48;
  pfVar1 = (float *)(lVar50 + (long)p_Var6 * (uVar53 + 3));
  fVar87 = *pfVar1;
  fVar60 = pfVar1[1];
  fVar148 = pfVar1[2];
  fVar220 = pfVar1[3];
  if (uVar54 != 0) {
    uVar56 = uVar54 - 1 & uVar54;
    for (uVar53 = uVar54; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar92._8_4_ = 0x80000000;
  auVar92._0_8_ = 0x8000000080000000;
  auVar92._12_4_ = 0x80000000;
  auVar109._0_4_ = fVar87 * -0.0;
  auVar109._4_4_ = fVar60 * -0.0;
  auVar109._8_4_ = fVar148 * -0.0;
  auVar109._12_4_ = fVar220 * -0.0;
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar155,auVar109);
  auVar63._0_4_ = auVar241._0_4_ + auVar62._0_4_;
  auVar63._4_4_ = auVar241._4_4_ + auVar62._4_4_;
  auVar63._8_4_ = auVar241._8_4_ + auVar62._8_4_;
  auVar63._12_4_ = auVar241._12_4_ + auVar62._12_4_;
  auVar235 = vfmadd231ps_fma(auVar63,auVar11,auVar92);
  auVar123 = ZEXT816(0) << 0x40;
  auVar93._0_4_ = fVar87 * 0.0;
  auVar93._4_4_ = fVar60 * 0.0;
  auVar93._8_4_ = fVar148 * 0.0;
  auVar93._12_4_ = fVar220 * 0.0;
  auVar266._8_4_ = 0x3f000000;
  auVar266._0_8_ = 0x3f0000003f000000;
  auVar266._12_4_ = 0x3f000000;
  auVar62 = vfmadd231ps_fma(auVar93,auVar155,auVar266);
  auVar62 = vfmadd231ps_fma(auVar62,auVar241,auVar123);
  auVar127 = vfnmadd231ps_fma(auVar62,auVar11,auVar266);
  auVar249._0_4_ = fVar59 * -0.0;
  auVar249._4_4_ = fVar85 * -0.0;
  auVar249._8_4_ = fVar122 * -0.0;
  auVar249._12_4_ = fVar86 * -0.0;
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar130,auVar249);
  auVar240._0_4_ = auVar62._0_4_ + auVar12._0_4_;
  auVar240._4_4_ = auVar62._4_4_ + auVar12._4_4_;
  auVar240._8_4_ = auVar62._8_4_ + auVar12._8_4_;
  auVar240._12_4_ = auVar62._12_4_ + auVar12._12_4_;
  auVar62 = vfmadd231ps_fma(auVar240,auVar10,auVar92);
  auVar233._0_4_ = fVar59 * 0.0;
  auVar233._4_4_ = fVar85 * 0.0;
  auVar233._8_4_ = fVar122 * 0.0;
  auVar233._12_4_ = fVar86 * 0.0;
  auVar90 = vfmadd231ps_fma(auVar233,auVar130,auVar266);
  auVar90 = vfmadd231ps_fma(auVar90,auVar12,auVar123);
  auVar91 = vfnmadd231ps_fma(auVar90,auVar10,auVar266);
  auVar110._0_4_ = auVar155._0_4_ + auVar109._0_4_;
  auVar110._4_4_ = auVar155._4_4_ + auVar109._4_4_;
  auVar110._8_4_ = auVar155._8_4_ + auVar109._8_4_;
  auVar110._12_4_ = auVar155._12_4_ + auVar109._12_4_;
  auVar90 = vfmadd231ps_fma(auVar110,auVar241,auVar123);
  auVar90 = vfmadd231ps_fma(auVar90,auVar11,auVar92);
  auVar124._0_4_ = fVar87 * 0.5;
  auVar124._4_4_ = fVar60 * 0.5;
  auVar124._8_4_ = fVar148 * 0.5;
  auVar124._12_4_ = fVar220 * 0.5;
  auVar155 = vfmadd231ps_fma(auVar124,auVar123,auVar155);
  auVar241 = vfnmadd231ps_fma(auVar155,auVar266,auVar241);
  auVar108 = vfmadd231ps_fma(auVar241,auVar123,auVar11);
  auVar199._0_4_ = auVar249._0_4_ + auVar130._0_4_;
  auVar199._4_4_ = auVar249._4_4_ + auVar130._4_4_;
  auVar199._8_4_ = auVar249._8_4_ + auVar130._8_4_;
  auVar199._12_4_ = auVar249._12_4_ + auVar130._12_4_;
  auVar11 = vfmadd231ps_fma(auVar199,auVar12,auVar123);
  auVar241 = vfmadd231ps_fma(auVar11,auVar10,auVar92);
  auVar208._0_4_ = fVar59 * 0.5;
  auVar208._4_4_ = fVar85 * 0.5;
  auVar208._8_4_ = fVar122 * 0.5;
  auVar208._12_4_ = fVar86 * 0.5;
  auVar130 = vfmadd231ps_fma(auVar208,auVar123,auVar130);
  auVar12 = vfnmadd231ps_fma(auVar130,auVar266,auVar12);
  auVar155 = vfmadd231ps_fma(auVar12,auVar123,auVar10);
  auVar10 = vshufps_avx(auVar127,auVar127,0xc9);
  auVar12 = vshufps_avx(auVar62,auVar62,0xc9);
  fVar87 = auVar127._0_4_;
  auVar150._0_4_ = fVar87 * auVar12._0_4_;
  fVar60 = auVar127._4_4_;
  auVar150._4_4_ = fVar60 * auVar12._4_4_;
  fVar148 = auVar127._8_4_;
  auVar150._8_4_ = fVar148 * auVar12._8_4_;
  fVar220 = auVar127._12_4_;
  auVar150._12_4_ = fVar220 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar150,auVar10,auVar62);
  auVar130 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar151._0_4_ = fVar87 * auVar12._0_4_;
  auVar151._4_4_ = fVar60 * auVar12._4_4_;
  auVar151._8_4_ = fVar148 * auVar12._8_4_;
  auVar151._12_4_ = fVar220 * auVar12._12_4_;
  auVar10 = vfmsub231ps_fma(auVar151,auVar10,auVar91);
  auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar12 = vshufps_avx(auVar241,auVar241,0xc9);
  fVar121 = auVar108._0_4_;
  auVar137._0_4_ = fVar121 * auVar12._0_4_;
  fVar182 = auVar108._4_4_;
  auVar137._4_4_ = fVar182 * auVar12._4_4_;
  fVar196 = auVar108._8_4_;
  auVar137._8_4_ = fVar196 * auVar12._8_4_;
  fVar197 = auVar108._12_4_;
  auVar137._12_4_ = fVar197 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar137,auVar10,auVar241);
  auVar241 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar155,auVar155,0xc9);
  auVar169._0_4_ = fVar121 * auVar12._0_4_;
  auVar169._4_4_ = fVar182 * auVar12._4_4_;
  auVar169._8_4_ = fVar196 * auVar12._8_4_;
  auVar169._12_4_ = fVar197 * auVar12._12_4_;
  auVar10 = vfmsub231ps_fma(auVar169,auVar10,auVar155);
  auVar155 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vdpps_avx(auVar130,auVar130,0x7f);
  fVar85 = auVar10._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar85;
  auVar12 = vrsqrtss_avx(auVar209,auVar209);
  fVar59 = auVar12._0_4_;
  fVar59 = fVar59 * 1.5 + fVar85 * -0.5 * fVar59 * fVar59 * fVar59;
  auVar12 = vdpps_avx(auVar130,auVar11,0x7f);
  fVar147 = fVar59 * auVar130._0_4_;
  fVar163 = fVar59 * auVar130._4_4_;
  fVar164 = fVar59 * auVar130._8_4_;
  fVar165 = fVar59 * auVar130._12_4_;
  auVar222._0_4_ = auVar11._0_4_ * fVar85;
  auVar222._4_4_ = auVar11._4_4_ * fVar85;
  auVar222._8_4_ = auVar11._8_4_ * fVar85;
  auVar222._12_4_ = auVar11._12_4_ * fVar85;
  fVar85 = auVar12._0_4_;
  auVar185._0_4_ = fVar85 * auVar130._0_4_;
  auVar185._4_4_ = fVar85 * auVar130._4_4_;
  auVar185._8_4_ = fVar85 * auVar130._8_4_;
  auVar185._12_4_ = fVar85 * auVar130._12_4_;
  auVar130 = vsubps_avx(auVar222,auVar185);
  auVar12 = vrcpss_avx(auVar209,auVar209);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar122 = auVar12._0_4_ * auVar10._0_4_;
  auVar10 = vdpps_avx(auVar241,auVar241,0x7f);
  fVar86 = auVar10._0_4_;
  auVar210._4_12_ = ZEXT812(0) << 0x20;
  auVar210._0_4_ = fVar86;
  auVar12 = vrsqrtss_avx(auVar210,auVar210);
  fVar85 = auVar12._0_4_;
  auVar12 = vdpps_avx(auVar241,auVar155,0x7f);
  fVar85 = fVar85 * 1.5 + fVar86 * -0.5 * fVar85 * fVar85 * fVar85;
  fVar248 = fVar85 * auVar241._0_4_;
  fVar256 = fVar85 * auVar241._4_4_;
  fVar257 = fVar85 * auVar241._8_4_;
  fVar258 = fVar85 * auVar241._12_4_;
  auVar170._0_4_ = fVar86 * auVar155._0_4_;
  auVar170._4_4_ = fVar86 * auVar155._4_4_;
  auVar170._8_4_ = fVar86 * auVar155._8_4_;
  auVar170._12_4_ = fVar86 * auVar155._12_4_;
  fVar86 = auVar12._0_4_;
  auVar138._0_4_ = fVar86 * auVar241._0_4_;
  auVar138._4_4_ = fVar86 * auVar241._4_4_;
  auVar138._8_4_ = fVar86 * auVar241._8_4_;
  auVar138._12_4_ = fVar86 * auVar241._12_4_;
  auVar11 = vsubps_avx(auVar170,auVar138);
  auVar12 = vrcpss_avx(auVar210,auVar210);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar86 = auVar10._0_4_ * auVar12._0_4_;
  auVar10 = vshufps_avx(auVar235,auVar235,0xff);
  auVar200._0_4_ = auVar10._0_4_ * fVar147;
  auVar200._4_4_ = auVar10._4_4_ * fVar163;
  auVar200._8_4_ = auVar10._8_4_ * fVar164;
  auVar200._12_4_ = auVar10._12_4_ * fVar165;
  local_448 = vsubps_avx(auVar235,auVar200);
  auVar12 = vshufps_avx(auVar127,auVar127,0xff);
  auVar152._0_4_ = auVar12._0_4_ * fVar147 + auVar10._0_4_ * fVar59 * fVar122 * auVar130._0_4_;
  auVar152._4_4_ = auVar12._4_4_ * fVar163 + auVar10._4_4_ * fVar59 * fVar122 * auVar130._4_4_;
  auVar152._8_4_ = auVar12._8_4_ * fVar164 + auVar10._8_4_ * fVar59 * fVar122 * auVar130._8_4_;
  auVar152._12_4_ = auVar12._12_4_ * fVar165 + auVar10._12_4_ * fVar59 * fVar122 * auVar130._12_4_;
  auVar130 = vsubps_avx(auVar127,auVar152);
  local_458._0_4_ = auVar200._0_4_ + auVar235._0_4_;
  local_458._4_4_ = auVar200._4_4_ + auVar235._4_4_;
  fStack_450 = auVar200._8_4_ + auVar235._8_4_;
  fStack_44c = auVar200._12_4_ + auVar235._12_4_;
  auVar10 = vshufps_avx(auVar90,auVar90,0xff);
  auVar94._0_4_ = fVar248 * auVar10._0_4_;
  auVar94._4_4_ = fVar256 * auVar10._4_4_;
  auVar94._8_4_ = fVar257 * auVar10._8_4_;
  auVar94._12_4_ = fVar258 * auVar10._12_4_;
  local_468 = vsubps_avx(auVar90,auVar94);
  auVar12 = vshufps_avx(auVar108,auVar108,0xff);
  auVar64._0_4_ = fVar248 * auVar12._0_4_ + auVar10._0_4_ * fVar85 * auVar11._0_4_ * fVar86;
  auVar64._4_4_ = fVar256 * auVar12._4_4_ + auVar10._4_4_ * fVar85 * auVar11._4_4_ * fVar86;
  auVar64._8_4_ = fVar257 * auVar12._8_4_ + auVar10._8_4_ * fVar85 * auVar11._8_4_ * fVar86;
  auVar64._12_4_ = fVar258 * auVar12._12_4_ + auVar10._12_4_ * fVar85 * auVar11._12_4_ * fVar86;
  auVar10 = vsubps_avx(auVar108,auVar64);
  local_4b8 = auVar90._0_4_ + auVar94._0_4_;
  fStack_4b4 = auVar90._4_4_ + auVar94._4_4_;
  fStack_4b0 = auVar90._8_4_ + auVar94._8_4_;
  fStack_4ac = auVar90._12_4_ + auVar94._12_4_;
  local_478._0_4_ = local_448._0_4_ + auVar130._0_4_ * 0.33333334;
  local_478._4_4_ = local_448._4_4_ + auVar130._4_4_ * 0.33333334;
  local_478._8_4_ = local_448._8_4_ + auVar130._8_4_ * 0.33333334;
  local_478._12_4_ = local_448._12_4_ + auVar130._12_4_ * 0.33333334;
  auVar65._0_4_ = auVar10._0_4_ * 0.33333334;
  auVar65._4_4_ = auVar10._4_4_ * 0.33333334;
  auVar65._8_4_ = auVar10._8_4_ * 0.33333334;
  auVar65._12_4_ = auVar10._12_4_ * 0.33333334;
  local_488 = vsubps_avx(local_468,auVar65);
  aVar2 = (ray->org).field_0;
  auVar130 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar130,auVar130,0x55);
  auVar12 = vshufps_avx(auVar130,auVar130,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar59 = (pre->ray_space).vz.field_0.m128[0];
  fVar85 = (pre->ray_space).vz.field_0.m128[1];
  fVar122 = (pre->ray_space).vz.field_0.m128[2];
  fVar86 = (pre->ray_space).vz.field_0.m128[3];
  auVar139._0_4_ = fVar59 * auVar12._0_4_;
  auVar139._4_4_ = fVar85 * auVar12._4_4_;
  auVar139._8_4_ = fVar122 * auVar12._8_4_;
  auVar139._12_4_ = fVar86 * auVar12._12_4_;
  auVar108 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar3,auVar10);
  auVar11 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar11,auVar11,0x55);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar66._0_4_ = fVar59 * auVar12._0_4_;
  auVar66._4_4_ = fVar85 * auVar12._4_4_;
  auVar66._8_4_ = fVar122 * auVar12._8_4_;
  auVar66._12_4_ = fVar86 * auVar12._12_4_;
  auVar127 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar10);
  auVar12 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar111._0_4_ = fVar59 * auVar10._0_4_;
  auVar111._4_4_ = fVar85 * auVar10._4_4_;
  auVar111._8_4_ = fVar122 * auVar10._8_4_;
  auVar111._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar12,auVar12,0x55);
  auVar91 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar3,auVar10);
  auVar241 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar125._0_4_ = fVar59 * auVar10._0_4_;
  auVar125._4_4_ = fVar85 * auVar10._4_4_;
  auVar125._8_4_ = fVar122 * auVar10._8_4_;
  auVar125._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar241,auVar241,0x55);
  auVar123 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar3,auVar10);
  auVar155 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar155,auVar155,0xaa);
  auVar95._0_4_ = fVar59 * auVar10._0_4_;
  auVar95._4_4_ = fVar85 * auVar10._4_4_;
  auVar95._8_4_ = fVar122 * auVar10._8_4_;
  auVar95._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar155,auVar155,0x55);
  auVar136 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar10);
  local_498._0_4_ = (fVar87 + auVar152._0_4_) * 0.33333334 + (float)local_458._0_4_;
  local_498._4_4_ = (fVar60 + auVar152._4_4_) * 0.33333334 + (float)local_458._4_4_;
  fStack_490 = (fVar148 + auVar152._8_4_) * 0.33333334 + fStack_450;
  fStack_48c = (fVar220 + auVar152._12_4_) * 0.33333334 + fStack_44c;
  auVar62 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar234._0_4_ = fVar59 * auVar10._0_4_;
  auVar234._4_4_ = fVar85 * auVar10._4_4_;
  auVar234._8_4_ = fVar122 * auVar10._8_4_;
  auVar234._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar62,auVar62,0x55);
  auVar61 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar3,auVar10);
  auVar223._0_4_ = (fVar121 + auVar64._0_4_) * 0.33333334;
  auVar223._4_4_ = (fVar182 + auVar64._4_4_) * 0.33333334;
  auVar223._8_4_ = (fVar196 + auVar64._8_4_) * 0.33333334;
  auVar223._12_4_ = (fVar197 + auVar64._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4b4;
  auVar42._0_4_ = local_4b8;
  auVar42._8_4_ = fStack_4b0;
  auVar42._12_4_ = fStack_4ac;
  _local_4a8 = vsubps_avx(auVar42,auVar223);
  auVar235 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar224._0_4_ = fVar59 * auVar10._0_4_;
  auVar224._4_4_ = fVar85 * auVar10._4_4_;
  auVar224._8_4_ = fVar122 * auVar10._8_4_;
  auVar224._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar235,auVar235,0x55);
  auVar89 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar3,auVar10);
  auVar90 = vsubps_avx(auVar42,(undefined1  [16])aVar2);
  auVar10 = vshufps_avx(auVar90,auVar90,0xaa);
  auVar186._0_4_ = fVar59 * auVar10._0_4_;
  auVar186._4_4_ = fVar85 * auVar10._4_4_;
  auVar186._8_4_ = fVar122 * auVar10._8_4_;
  auVar186._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar90,auVar90,0x55);
  auVar10 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar10);
  local_518._0_4_ = auVar130._0_4_;
  auVar171._4_4_ = local_518._0_4_;
  auVar171._0_4_ = local_518._0_4_;
  auVar171._8_4_ = local_518._0_4_;
  auVar171._12_4_ = local_518._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar108 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar3,auVar171);
  local_4d8._0_4_ = auVar11._0_4_;
  auVar172._4_4_ = local_4d8._0_4_;
  auVar172._0_4_ = local_4d8._0_4_;
  auVar172._8_4_ = local_4d8._0_4_;
  auVar172._12_4_ = local_4d8._0_4_;
  auVar11 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar3,auVar172);
  uVar57 = auVar12._0_4_;
  auVar173._4_4_ = uVar57;
  auVar173._0_4_ = uVar57;
  auVar173._8_4_ = uVar57;
  auVar173._12_4_ = uVar57;
  auVar127 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar3,auVar173);
  uVar57 = auVar241._0_4_;
  auVar174._4_4_ = uVar57;
  auVar174._0_4_ = uVar57;
  auVar174._8_4_ = uVar57;
  auVar174._12_4_ = uVar57;
  auVar241 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar174);
  uVar57 = auVar155._0_4_;
  auVar175._4_4_ = uVar57;
  auVar175._0_4_ = uVar57;
  auVar175._8_4_ = uVar57;
  auVar175._12_4_ = uVar57;
  auVar155 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar3,auVar175);
  uVar57 = auVar62._0_4_;
  auVar176._4_4_ = uVar57;
  auVar176._0_4_ = uVar57;
  auVar176._8_4_ = uVar57;
  auVar176._12_4_ = uVar57;
  auVar62 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar3,auVar176);
  uVar57 = auVar235._0_4_;
  auVar67._4_4_ = uVar57;
  auVar67._0_4_ = uVar57;
  auVar67._8_4_ = uVar57;
  auVar67._12_4_ = uVar57;
  auVar235 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar67);
  uVar57 = auVar90._0_4_;
  auVar68._4_4_ = uVar57;
  auVar68._0_4_ = uVar57;
  auVar68._8_4_ = uVar57;
  auVar68._12_4_ = uVar57;
  auVar90 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar68);
  local_4d8 = vmovlhps_avx(auVar108,auVar155);
  local_4e8 = vmovlhps_avx(auVar11,auVar62);
  local_4f8 = vmovlhps_avx(auVar127,auVar235);
  _local_218 = vmovlhps_avx(auVar241,auVar90);
  auVar10 = vminps_avx(local_4d8,local_4e8);
  auVar12 = vminps_avx(local_4f8,_local_218);
  auVar130 = vminps_avx(auVar10,auVar12);
  auVar10 = vmaxps_avx(local_4d8,local_4e8);
  auVar12 = vmaxps_avx(local_4f8,_local_218);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vshufpd_avx(auVar130,auVar130,3);
  auVar130 = vminps_avx(auVar130,auVar12);
  auVar12 = vshufpd_avx(auVar10,auVar10,3);
  auVar12 = vmaxps_avx(auVar10,auVar12);
  auVar10 = vandps_avx(local_318,auVar130);
  auVar12 = vandps_avx(local_318,auVar12);
  auVar10 = vmaxps_avx(auVar10,auVar12);
  auVar12 = vmovshdup_avx(auVar10);
  auVar10 = vmaxss_avx(auVar12,auVar10);
  local_78 = auVar10._0_4_ * 9.536743e-07;
  local_3c8._0_8_ = auVar108._0_8_;
  local_3c8._8_8_ = local_3c8._0_8_;
  local_3d8._0_8_ = auVar11._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._8_8_ = auVar127._0_8_;
  local_3e8._0_8_ = auVar127._0_8_;
  local_3f8._8_8_ = auVar241._0_8_;
  local_3f8._0_8_ = auVar241._0_8_;
  register0x00001388 = auVar155._0_8_;
  local_408 = auVar155._0_8_;
  local_418 = auVar62._0_8_;
  register0x000014c8 = local_418;
  local_428 = auVar235._0_8_;
  register0x00001488 = local_428;
  register0x000012c8 = auVar90._0_8_;
  local_438 = auVar90._0_8_;
  local_228 = ZEXT416((uint)local_78);
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar58 = false;
  uVar53 = 0;
  local_1e8 = vsubps_avx(local_4e8,local_4d8);
  local_1f8 = vsubps_avx(local_4f8,local_4e8);
  local_208 = vsubps_avx(_local_218,local_4f8);
  local_258 = vsubps_avx(_local_458,local_448);
  local_268 = vsubps_avx(_local_498,local_478);
  local_278 = vsubps_avx(_local_4a8,local_488);
  auVar43._4_4_ = fStack_4b4;
  auVar43._0_4_ = local_4b8;
  auVar43._8_4_ = fStack_4b0;
  auVar43._12_4_ = fStack_4ac;
  _local_288 = vsubps_avx(auVar43,local_468);
  auVar69 = ZEXT816(0x3f80000000000000);
  local_238 = auVar69;
LAB_011835aa:
  auVar10 = vshufps_avx(auVar69,auVar69,0x50);
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = 0x3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar270._16_4_ = 0x3f800000;
  auVar270._0_16_ = auVar267;
  auVar270._20_4_ = 0x3f800000;
  auVar270._24_4_ = 0x3f800000;
  auVar270._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar267,auVar10);
  fVar59 = auVar10._0_4_;
  auVar70._0_4_ = local_408._0_4_ * fVar59;
  fVar85 = auVar10._4_4_;
  auVar70._4_4_ = local_408._4_4_ * fVar85;
  fVar122 = auVar10._8_4_;
  auVar70._8_4_ = local_408._8_4_ * fVar122;
  fVar86 = auVar10._12_4_;
  auVar70._12_4_ = local_408._12_4_ * fVar86;
  auVar177._0_4_ = local_418._0_4_ * fVar59;
  auVar177._4_4_ = local_418._4_4_ * fVar85;
  auVar177._8_4_ = local_418._8_4_ * fVar122;
  auVar177._12_4_ = local_418._12_4_ * fVar86;
  auVar140._0_4_ = local_428._0_4_ * fVar59;
  auVar140._4_4_ = local_428._4_4_ * fVar85;
  auVar140._8_4_ = local_428._8_4_ * fVar122;
  auVar140._12_4_ = local_428._12_4_ * fVar86;
  auVar112._0_4_ = local_438._0_4_ * fVar59;
  auVar112._4_4_ = local_438._4_4_ * fVar85;
  auVar112._8_4_ = local_438._8_4_ * fVar122;
  auVar112._12_4_ = local_438._12_4_ * fVar86;
  auVar241 = vfmadd231ps_fma(auVar70,auVar12,local_3c8);
  auVar155 = vfmadd231ps_fma(auVar177,auVar12,local_3d8);
  auVar62 = vfmadd231ps_fma(auVar140,auVar12,local_3e8);
  auVar235 = vfmadd231ps_fma(auVar112,local_3f8,auVar12);
  auVar10 = vmovshdup_avx(local_238);
  fVar59 = local_238._0_4_;
  fStack_140 = (auVar10._0_4_ - fVar59) * 0.04761905;
  auVar218._4_4_ = fVar59;
  auVar218._0_4_ = fVar59;
  auVar218._8_4_ = fVar59;
  auVar218._12_4_ = fVar59;
  auVar218._16_4_ = fVar59;
  auVar218._20_4_ = fVar59;
  auVar218._24_4_ = fVar59;
  auVar218._28_4_ = fVar59;
  auVar105._0_8_ = auVar10._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar82 = vsubps_avx(auVar105,auVar218);
  uVar57 = auVar241._0_4_;
  auVar264._4_4_ = uVar57;
  auVar264._0_4_ = uVar57;
  auVar264._8_4_ = uVar57;
  auVar264._12_4_ = uVar57;
  auVar264._16_4_ = uVar57;
  auVar264._20_4_ = uVar57;
  auVar264._24_4_ = uVar57;
  auVar264._28_4_ = uVar57;
  auVar10 = vmovshdup_avx(auVar241);
  uVar88 = auVar10._0_8_;
  auVar255._8_8_ = uVar88;
  auVar255._0_8_ = uVar88;
  auVar255._16_8_ = uVar88;
  auVar255._24_8_ = uVar88;
  fVar121 = auVar155._0_4_;
  auVar245._4_4_ = fVar121;
  auVar245._0_4_ = fVar121;
  auVar245._8_4_ = fVar121;
  auVar245._12_4_ = fVar121;
  auVar245._16_4_ = fVar121;
  auVar245._20_4_ = fVar121;
  auVar245._24_4_ = fVar121;
  auVar245._28_4_ = fVar121;
  auVar12 = vmovshdup_avx(auVar155);
  auVar106._0_8_ = auVar12._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar220 = auVar62._0_4_;
  auVar193._4_4_ = fVar220;
  auVar193._0_4_ = fVar220;
  auVar193._8_4_ = fVar220;
  auVar193._12_4_ = fVar220;
  auVar193._16_4_ = fVar220;
  auVar193._20_4_ = fVar220;
  auVar193._24_4_ = fVar220;
  auVar193._28_4_ = fVar220;
  auVar130 = vmovshdup_avx(auVar62);
  auVar204._0_8_ = auVar130._0_8_;
  auVar204._8_8_ = auVar204._0_8_;
  auVar204._16_8_ = auVar204._0_8_;
  auVar204._24_8_ = auVar204._0_8_;
  fVar148 = auVar235._0_4_;
  auVar11 = vmovshdup_avx(auVar235);
  auVar90 = vfmadd132ps_fma(auVar82,auVar218,_DAT_01f7b040);
  auVar82 = vsubps_avx(auVar270,ZEXT1632(auVar90));
  fVar59 = auVar90._0_4_;
  fVar85 = auVar90._4_4_;
  auVar13._4_4_ = fVar121 * fVar85;
  auVar13._0_4_ = fVar121 * fVar59;
  fVar122 = auVar90._8_4_;
  auVar13._8_4_ = fVar121 * fVar122;
  fVar86 = auVar90._12_4_;
  auVar13._12_4_ = fVar121 * fVar86;
  auVar13._16_4_ = fVar121 * 0.0;
  auVar13._20_4_ = fVar121 * 0.0;
  auVar13._24_4_ = fVar121 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar90 = vfmadd231ps_fma(auVar13,auVar82,auVar264);
  fVar87 = auVar12._0_4_;
  fVar60 = auVar12._4_4_;
  auVar14._4_4_ = fVar60 * fVar85;
  auVar14._0_4_ = fVar87 * fVar59;
  auVar14._8_4_ = fVar87 * fVar122;
  auVar14._12_4_ = fVar60 * fVar86;
  auVar14._16_4_ = fVar87 * 0.0;
  auVar14._20_4_ = fVar60 * 0.0;
  auVar14._24_4_ = fVar87 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar108 = vfmadd231ps_fma(auVar14,auVar82,auVar255);
  auVar15._4_4_ = fVar220 * fVar85;
  auVar15._0_4_ = fVar220 * fVar59;
  auVar15._8_4_ = fVar220 * fVar122;
  auVar15._12_4_ = fVar220 * fVar86;
  auVar15._16_4_ = fVar220 * 0.0;
  auVar15._20_4_ = fVar220 * 0.0;
  auVar15._24_4_ = fVar220 * 0.0;
  auVar15._28_4_ = auVar10._4_4_;
  auVar127 = vfmadd231ps_fma(auVar15,auVar82,auVar245);
  fVar87 = auVar130._0_4_;
  fVar60 = auVar130._4_4_;
  auVar9._4_4_ = fVar60 * fVar85;
  auVar9._0_4_ = fVar87 * fVar59;
  auVar9._8_4_ = fVar87 * fVar122;
  auVar9._12_4_ = fVar60 * fVar86;
  auVar9._16_4_ = fVar87 * 0.0;
  auVar9._20_4_ = fVar60 * 0.0;
  auVar9._24_4_ = fVar87 * 0.0;
  auVar9._28_4_ = fVar121;
  auVar91 = vfmadd231ps_fma(auVar9,auVar82,auVar106);
  auVar10 = vshufps_avx(auVar241,auVar241,0xaa);
  local_3b8._8_8_ = auVar10._0_8_;
  local_3b8._0_8_ = local_3b8._8_8_;
  local_3b8._16_8_ = local_3b8._8_8_;
  local_3b8._24_8_ = local_3b8._8_8_;
  auVar12 = vshufps_avx(auVar241,auVar241,0xff);
  uStack_510 = auVar12._0_8_;
  local_518 = (undefined1  [8])uStack_510;
  uStack_508 = uStack_510;
  uStack_500 = uStack_510;
  auVar247._4_4_ = fVar148 * fVar85;
  auVar247._0_4_ = fVar148 * fVar59;
  auVar247._8_4_ = fVar148 * fVar122;
  auVar247._12_4_ = fVar148 * fVar86;
  auVar247._16_4_ = fVar148 * 0.0;
  auVar247._20_4_ = fVar148 * 0.0;
  auVar247._24_4_ = fVar148 * 0.0;
  auVar247._28_4_ = fVar148;
  auVar241 = vfmadd231ps_fma(auVar247,auVar82,auVar193);
  auVar12 = vshufps_avx(auVar155,auVar155,0xaa);
  auVar194._0_8_ = auVar12._0_8_;
  auVar194._8_8_ = auVar194._0_8_;
  auVar194._16_8_ = auVar194._0_8_;
  auVar194._24_8_ = auVar194._0_8_;
  auVar130 = vshufps_avx(auVar155,auVar155,0xff);
  local_368._8_8_ = auVar130._0_8_;
  local_368._0_8_ = local_368._8_8_;
  local_368._16_8_ = local_368._8_8_;
  local_368._24_8_ = local_368._8_8_;
  fVar87 = auVar11._0_4_;
  fVar60 = auVar11._4_4_;
  auVar17._4_4_ = fVar60 * fVar85;
  auVar17._0_4_ = fVar87 * fVar59;
  auVar17._8_4_ = fVar87 * fVar122;
  auVar17._12_4_ = fVar60 * fVar86;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar60 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = auVar10._4_4_;
  auVar123 = vfmadd231ps_fma(auVar17,auVar82,auVar204);
  auVar18._28_4_ = fVar60;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar127._12_4_ * fVar86,
                          CONCAT48(auVar127._8_4_ * fVar122,
                                   CONCAT44(auVar127._4_4_ * fVar85,auVar127._0_4_ * fVar59))));
  auVar90 = vfmadd231ps_fma(auVar18,auVar82,ZEXT1632(auVar90));
  fVar87 = auVar130._4_4_;
  auVar19._28_4_ = fVar87;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar91._12_4_ * fVar86,
                          CONCAT48(auVar91._8_4_ * fVar122,
                                   CONCAT44(auVar91._4_4_ * fVar85,auVar91._0_4_ * fVar59))));
  auVar108 = vfmadd231ps_fma(auVar19,auVar82,ZEXT1632(auVar108));
  auVar10 = vshufps_avx(auVar62,auVar62,0xaa);
  uVar88 = auVar10._0_8_;
  auVar181._8_8_ = uVar88;
  auVar181._0_8_ = uVar88;
  auVar181._16_8_ = uVar88;
  auVar181._24_8_ = uVar88;
  auVar11 = vshufps_avx(auVar62,auVar62,0xff);
  uVar88 = auVar11._0_8_;
  auVar271._8_8_ = uVar88;
  auVar271._0_8_ = uVar88;
  auVar271._16_8_ = uVar88;
  auVar271._24_8_ = uVar88;
  auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar86,
                                               CONCAT48(auVar241._8_4_ * fVar122,
                                                        CONCAT44(auVar241._4_4_ * fVar85,
                                                                 auVar241._0_4_ * fVar59)))),auVar82
                            ,ZEXT1632(auVar127));
  auVar241 = vshufps_avx(auVar235,auVar235,0xaa);
  auVar155 = vshufps_avx(auVar235,auVar235,0xff);
  auVar235 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar123._12_4_,
                                                CONCAT48(fVar122 * auVar123._8_4_,
                                                         CONCAT44(fVar85 * auVar123._4_4_,
                                                                  fVar59 * auVar123._0_4_)))),
                             auVar82,ZEXT1632(auVar91));
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar62._12_4_,
                                                CONCAT48(fVar122 * auVar62._8_4_,
                                                         CONCAT44(fVar85 * auVar62._4_4_,
                                                                  fVar59 * auVar62._0_4_)))),auVar82
                             ,ZEXT1632(auVar90));
  auVar13 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar90));
  auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar235._12_4_,
                                               CONCAT48(fVar122 * auVar235._8_4_,
                                                        CONCAT44(fVar85 * auVar235._4_4_,
                                                                 fVar59 * auVar235._0_4_)))),auVar82
                            ,ZEXT1632(auVar108));
  auVar14 = vsubps_avx(ZEXT1632(auVar235),ZEXT1632(auVar108));
  fVar60 = auVar14._28_4_;
  auVar246._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar246._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar246._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar246._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar246._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar246._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar246._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar246._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fStack_2ec = fVar60;
  fVar148 = auVar12._0_4_;
  fVar220 = auVar12._4_4_;
  auVar20._4_4_ = fVar220 * fVar85;
  auVar20._0_4_ = fVar148 * fVar59;
  auVar20._8_4_ = fVar148 * fVar122;
  auVar20._12_4_ = fVar220 * fVar86;
  auVar20._16_4_ = fVar148 * 0.0;
  auVar20._20_4_ = fVar220 * 0.0;
  auVar20._24_4_ = fVar148 * 0.0;
  auVar20._28_4_ = fVar60;
  auVar12 = vfmadd231ps_fma(auVar20,auVar82,local_3b8);
  fVar148 = auVar130._0_4_;
  auVar21._4_4_ = fVar87 * fVar85;
  auVar21._0_4_ = fVar148 * fVar59;
  auVar21._8_4_ = fVar148 * fVar122;
  auVar21._12_4_ = fVar87 * fVar86;
  auVar21._16_4_ = fVar148 * 0.0;
  auVar21._20_4_ = fVar87 * 0.0;
  auVar21._24_4_ = fVar148 * 0.0;
  auVar21._28_4_ = 0;
  auVar130 = vfmadd231ps_fma(auVar21,auVar82,_local_518);
  fVar87 = auVar10._0_4_;
  fVar148 = auVar10._4_4_;
  auVar22._4_4_ = fVar148 * fVar85;
  auVar22._0_4_ = fVar87 * fVar59;
  auVar22._8_4_ = fVar87 * fVar122;
  auVar22._12_4_ = fVar148 * fVar86;
  auVar22._16_4_ = fVar87 * 0.0;
  auVar22._20_4_ = fVar148 * 0.0;
  auVar22._24_4_ = fVar87 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar10 = vfmadd231ps_fma(auVar22,auVar82,auVar194);
  fVar87 = auVar11._0_4_;
  fVar121 = auVar11._4_4_;
  auVar23._4_4_ = fVar121 * fVar85;
  auVar23._0_4_ = fVar87 * fVar59;
  auVar23._8_4_ = fVar87 * fVar122;
  auVar23._12_4_ = fVar121 * fVar86;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar121 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = fVar220;
  auVar11 = vfmadd231ps_fma(auVar23,auVar82,local_368);
  local_368 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar127));
  fVar87 = auVar241._0_4_;
  fVar148 = auVar241._4_4_;
  auVar24._4_4_ = fVar148 * fVar85;
  auVar24._0_4_ = fVar87 * fVar59;
  auVar24._8_4_ = fVar87 * fVar122;
  auVar24._12_4_ = fVar148 * fVar86;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar148 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar148;
  auVar241 = vfmadd231ps_fma(auVar24,auVar82,auVar181);
  _local_518 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar62));
  fVar87 = auVar155._0_4_;
  fVar148 = auVar155._4_4_;
  auVar25._4_4_ = fVar148 * fVar85;
  auVar25._0_4_ = fVar87 * fVar59;
  auVar25._8_4_ = fVar87 * fVar122;
  auVar25._12_4_ = fVar148 * fVar86;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar148 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar148;
  auVar155 = vfmadd231ps_fma(auVar25,auVar82,auVar271);
  auVar26._28_4_ = fVar121;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar10._12_4_ * fVar86,
                          CONCAT48(auVar10._8_4_ * fVar122,
                                   CONCAT44(auVar10._4_4_ * fVar85,auVar10._0_4_ * fVar59))));
  auVar12 = vfmadd231ps_fma(auVar26,auVar82,ZEXT1632(auVar12));
  auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar11._12_4_,
                                                CONCAT48(fVar122 * auVar11._8_4_,
                                                         CONCAT44(fVar85 * auVar11._4_4_,
                                                                  fVar59 * auVar11._0_4_)))),auVar82
                             ,ZEXT1632(auVar130));
  local_3b8._0_4_ = auVar127._0_4_ + auVar246._0_4_;
  local_3b8._4_4_ = auVar127._4_4_ + auVar246._4_4_;
  local_3b8._8_4_ = auVar127._8_4_ + auVar246._8_4_;
  local_3b8._12_4_ = auVar127._12_4_ + auVar246._12_4_;
  local_3b8._16_4_ = auVar246._16_4_ + 0.0;
  local_3b8._20_4_ = auVar246._20_4_ + 0.0;
  local_3b8._24_4_ = auVar246._24_4_ + 0.0;
  local_3b8._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar86,
                                               CONCAT48(auVar241._8_4_ * fVar122,
                                                        CONCAT44(auVar241._4_4_ * fVar85,
                                                                 auVar241._0_4_ * fVar59)))),auVar82
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar155._12_4_ * fVar86,
                                               CONCAT48(auVar155._8_4_ * fVar122,
                                                        CONCAT44(auVar155._4_4_ * fVar85,
                                                                 auVar155._0_4_ * fVar59)))),auVar82
                            ,ZEXT1632(auVar11));
  auVar241 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar10._12_4_,
                                                CONCAT48(fVar122 * auVar10._8_4_,
                                                         CONCAT44(fVar85 * auVar10._4_4_,
                                                                  fVar59 * auVar10._0_4_)))),auVar82
                             ,ZEXT1632(auVar12));
  auVar155 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar86,
                                                CONCAT48(auVar11._8_4_ * fVar122,
                                                         CONCAT44(auVar11._4_4_ * fVar85,
                                                                  auVar11._0_4_ * fVar59)))),
                             ZEXT1632(auVar130),auVar82);
  auVar82 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar13 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar130));
  auVar265._0_4_ = fStack_140 * auVar82._0_4_ * 3.0;
  auVar265._4_4_ = fStack_140 * auVar82._4_4_ * 3.0;
  auVar265._8_4_ = fStack_140 * auVar82._8_4_ * 3.0;
  auVar265._12_4_ = fStack_140 * auVar82._12_4_ * 3.0;
  auVar265._16_4_ = fStack_140 * auVar82._16_4_ * 3.0;
  auVar265._20_4_ = fStack_140 * auVar82._20_4_ * 3.0;
  auVar265._24_4_ = fStack_140 * auVar82._24_4_ * 3.0;
  auVar265._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_388 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar241));
  _local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar155));
  auVar82 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar127));
  auVar13 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar62));
  auVar14 = vsubps_avx(_local_388,local_368);
  fVar182 = auVar82._0_4_ + auVar14._0_4_;
  fVar196 = auVar82._4_4_ + auVar14._4_4_;
  fVar197 = auVar82._8_4_ + auVar14._8_4_;
  fVar147 = auVar82._12_4_ + auVar14._12_4_;
  fVar163 = auVar82._16_4_ + auVar14._16_4_;
  fVar164 = auVar82._20_4_ + auVar14._20_4_;
  fVar165 = auVar82._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(_local_2a8,_local_518);
  auVar83._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar83._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar83._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar83._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar83._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar83._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar83._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar83._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar62);
  fVar59 = auVar62._0_4_;
  local_178 = (float)local_308._0_4_ + fVar59;
  fVar85 = auVar62._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar85;
  fVar122 = auVar62._8_4_;
  fStack_170 = fStack_300 + fVar122;
  fVar86 = auVar62._12_4_;
  fStack_16c = fStack_2fc + fVar86;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar127);
  auVar13 = vsubps_avx(local_b8,auVar246);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar241._0_4_ + auVar265._0_4_;
  local_118._4_4_ = auVar241._4_4_ + auVar265._4_4_;
  local_118._8_4_ = auVar241._8_4_ + auVar265._8_4_;
  local_118._12_4_ = auVar241._12_4_ + auVar265._12_4_;
  local_118._16_4_ = auVar265._16_4_ + 0.0;
  local_118._20_4_ = auVar265._20_4_ + 0.0;
  local_118._24_4_ = auVar265._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar247 = ZEXT1632(auVar241);
  auVar13 = vsubps_avx(auVar247,auVar265);
  _local_308 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar87 = auVar155._0_4_;
  local_158 = fVar87 + local_158;
  fVar148 = auVar155._4_4_;
  fStack_154 = fVar148 + fStack_154;
  fVar220 = auVar155._8_4_;
  fStack_150 = fVar220 + fStack_150;
  fVar121 = auVar155._12_4_;
  fStack_14c = fVar121 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar155),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar85 * fVar196;
  auVar28._0_4_ = fVar59 * fVar182;
  auVar28._8_4_ = fVar122 * fVar197;
  auVar28._12_4_ = fVar86 * fVar147;
  auVar28._16_4_ = fVar163 * 0.0;
  auVar28._20_4_ = fVar164 * 0.0;
  auVar28._24_4_ = fVar165 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar10 = vfnmadd231ps_fma(auVar28,local_b8,auVar83);
  fStack_15c = fVar60 + 0.0;
  auVar29._4_4_ = fStack_174 * fVar196;
  auVar29._0_4_ = local_178 * fVar182;
  auVar29._8_4_ = fStack_170 * fVar197;
  auVar29._12_4_ = fStack_16c * fVar147;
  auVar29._16_4_ = fStack_168 * fVar163;
  auVar29._20_4_ = fStack_164 * fVar164;
  auVar29._24_4_ = fStack_160 * fVar165;
  auVar29._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar29,auVar83,local_3b8);
  auVar30._4_4_ = local_198._4_4_ * fVar196;
  auVar30._0_4_ = local_198._0_4_ * fVar182;
  auVar30._8_4_ = local_198._8_4_ * fVar197;
  auVar30._12_4_ = local_198._12_4_ * fVar147;
  auVar30._16_4_ = local_198._16_4_ * fVar163;
  auVar30._20_4_ = local_198._20_4_ * fVar164;
  auVar30._24_4_ = local_198._24_4_ * fVar165;
  auVar30._28_4_ = fVar60 + 0.0;
  auVar130 = vfnmadd231ps_fma(auVar30,local_d8,auVar83);
  auVar31._4_4_ = (float)local_518._4_4_ * fVar196;
  auVar31._0_4_ = (float)local_518._0_4_ * fVar182;
  auVar31._8_4_ = (float)uStack_510 * fVar197;
  auVar31._12_4_ = uStack_510._4_4_ * fVar147;
  auVar31._16_4_ = (float)uStack_508 * fVar163;
  auVar31._20_4_ = uStack_508._4_4_ * fVar164;
  auVar31._24_4_ = (float)uStack_500 * fVar165;
  auVar31._28_4_ = uStack_500._4_4_;
  auVar11 = vfnmadd231ps_fma(auVar31,local_368,auVar83);
  auVar205._0_4_ = fVar87 * fVar182;
  auVar205._4_4_ = fVar148 * fVar196;
  auVar205._8_4_ = fVar220 * fVar197;
  auVar205._12_4_ = fVar121 * fVar147;
  auVar205._16_4_ = fVar163 * 0.0;
  auVar205._20_4_ = fVar164 * 0.0;
  auVar205._24_4_ = fVar165 * 0.0;
  auVar205._28_4_ = 0;
  auVar241 = vfnmadd231ps_fma(auVar205,auVar247,auVar83);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar196;
  auVar32._0_4_ = local_158 * fVar182;
  auVar32._8_4_ = fStack_150 * fVar197;
  auVar32._12_4_ = fStack_14c * fVar147;
  auVar32._16_4_ = fStack_148 * fVar163;
  auVar32._20_4_ = fStack_144 * fVar164;
  auVar32._24_4_ = fStack_140 * fVar165;
  auVar32._28_4_ = local_368._28_4_;
  auVar62 = vfnmadd231ps_fma(auVar32,local_118,auVar83);
  auVar33._4_4_ = local_138._4_4_ * fVar196;
  auVar33._0_4_ = local_138._0_4_ * fVar182;
  auVar33._8_4_ = local_138._8_4_ * fVar197;
  auVar33._12_4_ = local_138._12_4_ * fVar147;
  auVar33._16_4_ = local_138._16_4_ * fVar163;
  auVar33._20_4_ = local_138._20_4_ * fVar164;
  auVar33._24_4_ = local_138._24_4_ * fVar165;
  auVar33._28_4_ = local_138._28_4_;
  auVar235 = vfnmadd231ps_fma(auVar33,_local_308,auVar83);
  auVar34._4_4_ = local_2a8._4_4_ * fVar196;
  auVar34._0_4_ = local_2a8._0_4_ * fVar182;
  auVar34._8_4_ = local_2a8._8_4_ * fVar197;
  auVar34._12_4_ = local_2a8._12_4_ * fVar147;
  auVar34._16_4_ = local_2a8._16_4_ * fVar163;
  auVar34._20_4_ = local_2a8._20_4_ * fVar164;
  auVar34._24_4_ = local_2a8._24_4_ * fVar165;
  auVar34._28_4_ = auVar82._28_4_ + auVar14._28_4_;
  auVar219 = ZEXT3264(_local_388);
  auVar90 = vfnmadd231ps_fma(auVar34,_local_388,auVar83);
  auVar13 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar82 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
  auVar14 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar11));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar11));
  auVar82 = vmaxps_avx(auVar82,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar241),ZEXT1632(auVar62));
  auVar13 = vmaxps_avx(ZEXT1632(auVar241),ZEXT1632(auVar62));
  auVar9 = vminps_avx(ZEXT1632(auVar235),ZEXT1632(auVar90));
  auVar15 = vminps_avx(auVar15,auVar9);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar235),ZEXT1632(auVar90));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar82,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar82 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar82 = vandps_avx(auVar13,auVar82);
  auVar13 = local_1b8 & auVar82;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_368,local_b8);
    auVar14 = vsubps_avx(_local_388,auVar247);
    fVar182 = auVar13._0_4_ + auVar14._0_4_;
    fVar196 = auVar13._4_4_ + auVar14._4_4_;
    fVar197 = auVar13._8_4_ + auVar14._8_4_;
    fVar147 = auVar13._12_4_ + auVar14._12_4_;
    fVar163 = auVar13._16_4_ + auVar14._16_4_;
    fVar164 = auVar13._20_4_ + auVar14._20_4_;
    fVar165 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_518,local_f8);
    auVar9 = vsubps_avx(_local_2a8,ZEXT1632(auVar155));
    auVar107._0_4_ = auVar15._0_4_ + auVar9._0_4_;
    auVar107._4_4_ = auVar15._4_4_ + auVar9._4_4_;
    auVar107._8_4_ = auVar15._8_4_ + auVar9._8_4_;
    auVar107._12_4_ = auVar15._12_4_ + auVar9._12_4_;
    auVar107._16_4_ = auVar15._16_4_ + auVar9._16_4_;
    auVar107._20_4_ = auVar15._20_4_ + auVar9._20_4_;
    auVar107._24_4_ = auVar15._24_4_ + auVar9._24_4_;
    fVar60 = auVar9._28_4_;
    auVar107._28_4_ = auVar15._28_4_ + fVar60;
    auVar35._4_4_ = fVar85 * fVar196;
    auVar35._0_4_ = fVar59 * fVar182;
    auVar35._8_4_ = fVar122 * fVar197;
    auVar35._12_4_ = fVar86 * fVar147;
    auVar35._16_4_ = fVar163 * 0.0;
    auVar35._20_4_ = fVar164 * 0.0;
    auVar35._24_4_ = fVar165 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar241 = vfnmadd231ps_fma(auVar35,auVar107,local_b8);
    auVar36._4_4_ = fVar196 * fStack_174;
    auVar36._0_4_ = fVar182 * local_178;
    auVar36._8_4_ = fVar197 * fStack_170;
    auVar36._12_4_ = fVar147 * fStack_16c;
    auVar36._16_4_ = fVar163 * fStack_168;
    auVar36._20_4_ = fVar164 * fStack_164;
    auVar36._24_4_ = fVar165 * fStack_160;
    auVar36._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_3b8,auVar107,auVar36);
    auVar37._4_4_ = fVar196 * local_198._4_4_;
    auVar37._0_4_ = fVar182 * local_198._0_4_;
    auVar37._8_4_ = fVar197 * local_198._8_4_;
    auVar37._12_4_ = fVar147 * local_198._12_4_;
    auVar37._16_4_ = fVar163 * local_198._16_4_;
    auVar37._20_4_ = fVar164 * local_198._20_4_;
    auVar37._24_4_ = fVar165 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_d8,auVar107,auVar37);
    auVar38._4_4_ = (float)local_518._4_4_ * fVar196;
    auVar38._0_4_ = (float)local_518._0_4_ * fVar182;
    auVar38._8_4_ = (float)uStack_510 * fVar197;
    auVar38._12_4_ = uStack_510._4_4_ * fVar147;
    auVar38._16_4_ = (float)uStack_508 * fVar163;
    auVar38._20_4_ = uStack_508._4_4_ * fVar164;
    auVar38._24_4_ = (float)uStack_500 * fVar165;
    auVar38._28_4_ = 0;
    auVar155 = vfnmadd231ps_fma(auVar38,auVar107,local_368);
    auVar134._0_4_ = fVar87 * fVar182;
    auVar134._4_4_ = fVar148 * fVar196;
    auVar134._8_4_ = fVar220 * fVar197;
    auVar134._12_4_ = fVar121 * fVar147;
    auVar134._16_4_ = fVar163 * 0.0;
    auVar134._20_4_ = fVar164 * 0.0;
    auVar134._24_4_ = fVar165 * 0.0;
    auVar134._28_4_ = 0;
    auVar62 = vfnmadd231ps_fma(auVar134,auVar107,auVar247);
    auVar39._4_4_ = fVar196 * fStack_154;
    auVar39._0_4_ = fVar182 * local_158;
    auVar39._8_4_ = fVar197 * fStack_150;
    auVar39._12_4_ = fVar147 * fStack_14c;
    auVar39._16_4_ = fVar163 * fStack_148;
    auVar39._20_4_ = fVar164 * fStack_144;
    auVar39._24_4_ = fVar165 * fStack_140;
    auVar39._28_4_ = fVar60;
    auVar130 = vfnmadd213ps_fma(local_118,auVar107,auVar39);
    auVar40._4_4_ = fVar196 * local_138._4_4_;
    auVar40._0_4_ = fVar182 * local_138._0_4_;
    auVar40._8_4_ = fVar197 * local_138._8_4_;
    auVar40._12_4_ = fVar147 * local_138._12_4_;
    auVar40._16_4_ = fVar163 * local_138._16_4_;
    auVar40._20_4_ = fVar164 * local_138._20_4_;
    auVar40._24_4_ = fVar165 * local_138._24_4_;
    auVar40._28_4_ = fVar60;
    auVar11 = vfnmadd213ps_fma(_local_308,auVar107,auVar40);
    auVar219 = ZEXT1664(auVar11);
    auVar41._4_4_ = fVar196 * local_2a8._4_4_;
    auVar41._0_4_ = fVar182 * local_2a8._0_4_;
    auVar41._8_4_ = fVar197 * local_2a8._8_4_;
    auVar41._12_4_ = fVar147 * local_2a8._12_4_;
    auVar41._16_4_ = fVar163 * local_2a8._16_4_;
    auVar41._20_4_ = fVar164 * local_2a8._20_4_;
    auVar41._24_4_ = fVar165 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar235 = vfnmadd231ps_fma(auVar41,auVar107,_local_388);
    auVar14 = vminps_avx(ZEXT1632(auVar241),ZEXT1632(auVar10));
    auVar13 = vmaxps_avx(ZEXT1632(auVar241),ZEXT1632(auVar10));
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar155));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar155));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vminps_avx(ZEXT1632(auVar62),ZEXT1632(auVar130));
    auVar14 = vmaxps_avx(ZEXT1632(auVar62),ZEXT1632(auVar130));
    auVar247 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar235));
    auVar9 = vminps_avx(auVar9,auVar247);
    auVar9 = vminps_avx(auVar15,auVar9);
    auVar15 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar235));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar9,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar82 = vandps_avx(auVar82,local_1b8);
    auVar14 = auVar82 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar82 = vandps_avx(auVar13,auVar82);
      uVar55 = vmovmskps_avx(auVar82);
      if (uVar55 != 0) {
        auStack_2e8[uVar53] = uVar55 & 0xff;
        uVar88 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar53 * 2) = uVar88;
        uVar56 = vmovlps_avx(auVar69);
        auStack_58[uVar53] = uVar56;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_01183b59:
  if ((int)uVar53 != 0) {
    uVar47 = (int)uVar53 - 1;
    uVar49 = (ulong)uVar47;
    uVar52 = auStack_2e8[uVar49];
    uVar55 = (&uStack_1d8)[uVar49 * 2];
    fVar59 = afStack_1d4[uVar49 * 2];
    iVar16 = 0;
    for (uVar56 = (ulong)uVar52; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      iVar16 = iVar16 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar53 = (ulong)uVar47;
    }
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_58[uVar49];
    auStack_2e8[uVar49] = uVar52;
    fVar85 = (float)(iVar16 + 1) * 0.14285715;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar16 * 0.14285715)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - (float)iVar16 * 0.14285715)));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar85)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - fVar85)));
    fVar85 = auVar12._0_4_;
    auVar195._0_4_ = auVar10._0_4_;
    fVar59 = fVar85 - auVar195._0_4_;
    if (fVar59 < 0.16666667) {
      auVar130 = vshufps_avx(auVar69,auVar69,0x50);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar11 = vsubps_avx(auVar96,auVar130);
      fVar122 = auVar130._0_4_;
      auVar141._0_4_ = fVar122 * (float)local_408._0_4_;
      fVar86 = auVar130._4_4_;
      auVar141._4_4_ = fVar86 * (float)local_408._4_4_;
      fVar87 = auVar130._8_4_;
      auVar141._8_4_ = fVar87 * fStack_400;
      fVar60 = auVar130._12_4_;
      auVar141._12_4_ = fVar60 * fStack_3fc;
      auVar153._0_4_ = fVar122 * (float)local_418._0_4_;
      auVar153._4_4_ = fVar86 * (float)local_418._4_4_;
      auVar153._8_4_ = fVar87 * fStack_410;
      auVar153._12_4_ = fVar60 * fStack_40c;
      auVar178._0_4_ = fVar122 * (float)local_428._0_4_;
      auVar178._4_4_ = fVar86 * (float)local_428._4_4_;
      auVar178._8_4_ = fVar87 * fStack_420;
      auVar178._12_4_ = fVar60 * fStack_41c;
      auVar71._0_4_ = fVar122 * (float)local_438._0_4_;
      auVar71._4_4_ = fVar86 * (float)local_438._4_4_;
      auVar71._8_4_ = fVar87 * fStack_430;
      auVar71._12_4_ = fVar60 * fStack_42c;
      auVar130 = vfmadd231ps_fma(auVar141,auVar11,local_3c8);
      auVar241 = vfmadd231ps_fma(auVar153,auVar11,local_3d8);
      auVar155 = vfmadd231ps_fma(auVar178,auVar11,local_3e8);
      auVar11 = vfmadd231ps_fma(auVar71,auVar11,local_3f8);
      auVar135._16_16_ = auVar130;
      auVar135._0_16_ = auVar130;
      auVar146._16_16_ = auVar241;
      auVar146._0_16_ = auVar241;
      auVar162._16_16_ = auVar155;
      auVar162._0_16_ = auVar155;
      _local_518 = auVar10;
      auVar195._4_4_ = auVar195._0_4_;
      auVar195._8_4_ = auVar195._0_4_;
      auVar195._12_4_ = auVar195._0_4_;
      auVar195._20_4_ = fVar85;
      auVar195._16_4_ = fVar85;
      auVar195._24_4_ = fVar85;
      auVar195._28_4_ = fVar85;
      auVar82 = vsubps_avx(auVar146,auVar135);
      auVar241 = vfmadd213ps_fma(auVar82,auVar195,auVar135);
      auVar82 = vsubps_avx(auVar162,auVar146);
      auVar62 = vfmadd213ps_fma(auVar82,auVar195,auVar146);
      auVar130 = vsubps_avx(auVar11,auVar155);
      auVar84._16_16_ = auVar130;
      auVar84._0_16_ = auVar130;
      auVar130 = vfmadd213ps_fma(auVar84,auVar195,auVar162);
      auVar82 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar241));
      auVar11 = vfmadd213ps_fma(auVar82,auVar195,ZEXT1632(auVar241));
      auVar82 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar62));
      auVar130 = vfmadd213ps_fma(auVar82,auVar195,ZEXT1632(auVar62));
      auVar82 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar11));
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar82,auVar195);
      fVar220 = auVar82._4_4_ * 3.0;
      local_368._0_4_ = fVar59;
      fVar122 = fVar59 * 0.33333334;
      auVar187._0_8_ =
           CONCAT44(auVar90._4_4_ + fVar122 * fVar220,auVar90._0_4_ + fVar122 * auVar82._0_4_ * 3.0)
      ;
      auVar187._8_4_ = auVar90._8_4_ + fVar122 * auVar82._8_4_ * 3.0;
      auVar187._12_4_ = auVar90._12_4_ + fVar122 * auVar82._12_4_ * 3.0;
      _local_2a8 = vshufpd_avx(auVar90,auVar90,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar130 = vsubps_avx(_local_2a8,auVar90);
      _local_388 = auVar11;
      auVar241 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar72._0_4_ = auVar130._0_4_ + auVar241._0_4_;
      auVar72._4_4_ = auVar130._4_4_ + auVar241._4_4_;
      auVar72._8_4_ = auVar130._8_4_ + auVar241._8_4_;
      auVar72._12_4_ = auVar130._12_4_ + auVar241._12_4_;
      auVar130 = vshufps_avx(auVar90,auVar90,0xb1);
      auVar241 = vshufps_avx(auVar187,auVar187,0xb1);
      auVar261._4_4_ = auVar72._0_4_;
      auVar261._0_4_ = auVar72._0_4_;
      auVar261._8_4_ = auVar72._0_4_;
      auVar261._12_4_ = auVar72._0_4_;
      auVar155 = vshufps_avx(auVar72,auVar72,0x55);
      fVar86 = auVar155._0_4_;
      auVar73._0_4_ = fVar86 * auVar130._0_4_;
      fVar87 = auVar155._4_4_;
      auVar73._4_4_ = fVar87 * auVar130._4_4_;
      fVar60 = auVar155._8_4_;
      auVar73._8_4_ = fVar60 * auVar130._8_4_;
      fVar148 = auVar155._12_4_;
      auVar73._12_4_ = fVar148 * auVar130._12_4_;
      auVar154._0_4_ = fVar86 * auVar241._0_4_;
      auVar154._4_4_ = fVar87 * auVar241._4_4_;
      auVar154._8_4_ = fVar60 * auVar241._8_4_;
      auVar154._12_4_ = fVar148 * auVar241._12_4_;
      auVar62 = vfmadd231ps_fma(auVar73,auVar261,auVar90);
      _local_308 = auVar187;
      auVar235 = vfmadd231ps_fma(auVar154,auVar261,auVar187);
      auVar241 = vshufps_avx(auVar62,auVar62,0xe8);
      auVar155 = vshufps_avx(auVar235,auVar235,0xe8);
      auVar130 = vcmpps_avx(auVar241,auVar155,1);
      uVar55 = vextractps_avx(auVar130,0);
      auVar108 = auVar235;
      if ((uVar55 & 1) == 0) {
        auVar108 = auVar62;
      }
      local_3b8._0_16_ = auVar12;
      auVar126._0_4_ = fVar122 * auVar82._16_4_ * 3.0;
      auVar126._4_4_ = fVar122 * fVar220;
      auVar126._8_4_ = fVar122 * auVar82._24_4_ * 3.0;
      auVar126._12_4_ = fVar122 * auVar219._28_4_;
      auVar136 = vsubps_avx((undefined1  [16])0x0,auVar126);
      auVar127 = vshufps_avx(auVar136,auVar136,0xb1);
      auVar91 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar188._0_4_ = fVar86 * auVar127._0_4_;
      auVar188._4_4_ = fVar87 * auVar127._4_4_;
      auVar188._8_4_ = fVar60 * auVar127._8_4_;
      auVar188._12_4_ = fVar148 * auVar127._12_4_;
      auVar201._0_4_ = auVar91._0_4_ * fVar86;
      auVar201._4_4_ = auVar91._4_4_ * fVar87;
      auVar201._8_4_ = auVar91._8_4_ * fVar60;
      auVar201._12_4_ = auVar91._12_4_ * fVar148;
      auVar61 = vfmadd231ps_fma(auVar188,auVar261,auVar136);
      auVar89 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar261);
      auVar91 = vshufps_avx(auVar61,auVar61,0xe8);
      auVar123 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar219 = ZEXT1664(auVar123);
      auVar127 = vcmpps_avx(auVar91,auVar123,1);
      uVar55 = vextractps_avx(auVar127,0);
      auVar149 = auVar89;
      if ((uVar55 & 1) == 0) {
        auVar149 = auVar61;
      }
      auVar108 = vmaxss_avx(auVar149,auVar108);
      auVar241 = vminps_avx(auVar241,auVar155);
      auVar155 = vminps_avx(auVar91,auVar123);
      auVar155 = vminps_avx(auVar241,auVar155);
      auVar130 = vshufps_avx(auVar130,auVar130,0x55);
      auVar130 = vblendps_avx(auVar130,auVar127,2);
      auVar127 = vpslld_avx(auVar130,0x1f);
      auVar130 = vshufpd_avx(auVar235,auVar235,1);
      auVar130 = vinsertps_avx(auVar130,auVar89,0x9c);
      auVar241 = vshufpd_avx(auVar62,auVar62,1);
      auVar241 = vinsertps_avx(auVar241,auVar61,0x9c);
      auVar130 = vblendvps_avx(auVar241,auVar130,auVar127);
      auVar241 = vmovshdup_avx(auVar130);
      auVar130 = vmaxss_avx(auVar241,auVar130);
      fVar60 = auVar155._0_4_;
      auVar241 = vmovshdup_avx(auVar155);
      fVar87 = auVar130._0_4_;
      fVar122 = auVar241._0_4_;
      fVar86 = auVar108._0_4_;
      if (((0.0001 <= fVar60) || (fVar87 <= -0.0001)) && (0.0001 <= fVar122 || fVar87 <= -0.0001))
      goto code_r0x01183e66;
      goto LAB_01183e8d;
    }
    local_238 = vinsertps_avx(auVar10,auVar12,0x10);
    goto LAB_011835aa;
  }
  if (bVar58) goto LAB_0118497d;
  fVar59 = ray->tfar;
  auVar81._4_4_ = fVar59;
  auVar81._0_4_ = fVar59;
  auVar81._8_4_ = fVar59;
  auVar81._12_4_ = fVar59;
  auVar10 = vcmpps_avx(local_248,auVar81,2);
  uVar55 = vmovmskps_avx(auVar10);
  uVar48 = (ulong)((uint)uVar54 & uVar55);
  goto LAB_01182e5d;
code_r0x01183e66:
  auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar62 = vcmpps_avx(auVar155,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar241 = vandps_avx(auVar62,auVar241);
  if (fVar86 <= -0.0001 || (auVar241 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01183b59;
LAB_01183e8d:
  auVar62 = vcmpps_avx(auVar155,_DAT_01f45a50,1);
  auVar235 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar241 = vcmpss_avx(auVar108,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar241 = vblendvps_avx(auVar97,auVar113,auVar241);
  auVar62 = vblendvps_avx(auVar97,auVar113,auVar62);
  fVar220 = auVar62._0_4_;
  fVar148 = auVar241._0_4_;
  auVar241 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar220 == fVar148) && (!NAN(fVar220) && !NAN(fVar148))) {
    auVar241 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar220 == fVar148) && (!NAN(fVar220) && !NAN(fVar148))) {
    auVar235 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar62 = vmovshdup_avx(auVar62);
  fVar121 = auVar62._0_4_;
  if ((fVar220 != fVar121) || (NAN(fVar220) || NAN(fVar121))) {
    if ((fVar122 != fVar60) || (NAN(fVar122) || NAN(fVar60))) {
      auVar128._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
      auVar128._8_4_ = auVar155._8_4_ ^ 0x80000000;
      auVar128._12_4_ = auVar155._12_4_ ^ 0x80000000;
      auVar129._0_4_ = -fVar60 / (fVar122 - fVar60);
      auVar129._4_12_ = auVar128._4_12_;
      auVar155 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar129,ZEXT416(0));
      auVar62 = auVar155;
    }
    else {
      auVar155 = ZEXT816(0) << 0x20;
      if ((fVar60 != 0.0) || (auVar62 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar60))) {
        auVar155 = SUB6416(ZEXT464(0x7f800000),0);
        auVar62 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar155);
    auVar235 = vmaxss_avx(auVar62,auVar235);
  }
  auVar130 = vcmpss_avx(auVar130,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar130 = vblendvps_avx(auVar98,auVar114,auVar130);
  fVar122 = auVar130._0_4_;
  if ((fVar148 != fVar122) || (NAN(fVar148) || NAN(fVar122))) {
    if ((fVar87 != fVar86) || (NAN(fVar87) || NAN(fVar86))) {
      auVar74._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = auVar108._8_4_ ^ 0x80000000;
      auVar74._12_4_ = auVar108._12_4_ ^ 0x80000000;
      auVar131._0_4_ = -fVar86 / (fVar87 - fVar86);
      auVar131._4_12_ = auVar74._4_12_;
      auVar130 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar131,ZEXT416(0));
      auVar155 = auVar130;
    }
    else {
      auVar130 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar86 != 0.0) || (auVar155 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar86))) {
        auVar130 = SUB6416(ZEXT464(0xff800000),0);
        auVar155 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar155);
    auVar235 = vmaxss_avx(auVar130,auVar235);
  }
  if ((fVar121 != fVar122) || (NAN(fVar121) || NAN(fVar122))) {
    auVar241 = vminss_avx(auVar241,SUB6416(ZEXT464(0x3f800000),0));
    auVar235 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar235);
  }
  auVar130 = vmaxss_avx(ZEXT816(0) << 0x40,auVar241);
  auVar241 = vminss_avx(auVar235,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar241._0_4_ < auVar130._0_4_) goto LAB_01183b59;
  auVar130 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar130._0_4_ + -0.1)));
  auVar241 = vminss_avx(ZEXT416((uint)(auVar241._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar142._0_8_ = auVar90._0_8_;
  auVar142._8_8_ = auVar142._0_8_;
  auVar211._8_8_ = auVar187._0_8_;
  auVar211._0_8_ = auVar187._0_8_;
  auVar225._8_8_ = auVar136._0_8_;
  auVar225._0_8_ = auVar136._0_8_;
  auVar155 = vshufpd_avx(auVar187,auVar187,3);
  auVar62 = vshufpd_avx(auVar136,auVar136,3);
  auVar235 = vshufps_avx(auVar130,auVar241,0);
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = 0x3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar90 = vsubps_avx(auVar75,auVar235);
  fVar122 = auVar235._0_4_;
  auVar76._0_4_ = fVar122 * (float)local_2a8._0_4_;
  fVar86 = auVar235._4_4_;
  auVar76._4_4_ = fVar86 * (float)local_2a8._4_4_;
  fVar87 = auVar235._8_4_;
  auVar76._8_4_ = fVar87 * fStack_2a0;
  fVar60 = auVar235._12_4_;
  auVar76._12_4_ = fVar60 * fStack_29c;
  auVar179._0_4_ = fVar122 * auVar155._0_4_;
  auVar179._4_4_ = fVar86 * auVar155._4_4_;
  auVar179._8_4_ = fVar87 * auVar155._8_4_;
  auVar179._12_4_ = fVar60 * auVar155._12_4_;
  auVar189._0_4_ = fVar122 * auVar62._0_4_;
  auVar189._4_4_ = fVar86 * auVar62._4_4_;
  auVar189._8_4_ = fVar87 * auVar62._8_4_;
  auVar189._12_4_ = fVar60 * auVar62._12_4_;
  local_388._0_4_ = auVar11._0_4_;
  local_388._4_4_ = auVar11._4_4_;
  fStack_380 = auVar11._8_4_;
  fStack_37c = auVar11._12_4_;
  auVar202._0_4_ = fVar122 * (float)local_388._0_4_;
  auVar202._4_4_ = fVar86 * (float)local_388._4_4_;
  auVar202._8_4_ = fVar87 * fStack_380;
  auVar202._12_4_ = fVar60 * fStack_37c;
  auVar62 = vfmadd231ps_fma(auVar76,auVar90,auVar142);
  auVar235 = vfmadd231ps_fma(auVar179,auVar90,auVar211);
  auVar108 = vfmadd231ps_fma(auVar189,auVar90,auVar225);
  auVar90 = vfmadd231ps_fma(auVar202,auVar90,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar69);
  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar130._0_4_)),auVar69,
                            ZEXT416((uint)(1.0 - auVar130._0_4_)));
  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar241._0_4_)),auVar69,
                            ZEXT416((uint)(1.0 - auVar241._0_4_)));
  fVar122 = 1.0 / fVar59;
  auVar130 = vsubps_avx(auVar235,auVar62);
  auVar212._0_4_ = auVar130._0_4_ * 3.0;
  auVar212._4_4_ = auVar130._4_4_ * 3.0;
  auVar212._8_4_ = auVar130._8_4_ * 3.0;
  auVar212._12_4_ = auVar130._12_4_ * 3.0;
  auVar130 = vsubps_avx(auVar108,auVar235);
  auVar226._0_4_ = auVar130._0_4_ * 3.0;
  auVar226._4_4_ = auVar130._4_4_ * 3.0;
  auVar226._8_4_ = auVar130._8_4_ * 3.0;
  auVar226._12_4_ = auVar130._12_4_ * 3.0;
  auVar130 = vsubps_avx(auVar90,auVar108);
  auVar236._0_4_ = auVar130._0_4_ * 3.0;
  auVar236._4_4_ = auVar130._4_4_ * 3.0;
  auVar236._8_4_ = auVar130._8_4_ * 3.0;
  auVar236._12_4_ = auVar130._12_4_ * 3.0;
  auVar11 = vminps_avx(auVar226,auVar236);
  auVar130 = vmaxps_avx(auVar226,auVar236);
  auVar11 = vminps_avx(auVar212,auVar11);
  auVar130 = vmaxps_avx(auVar212,auVar130);
  auVar241 = vshufpd_avx(auVar11,auVar11,3);
  auVar155 = vshufpd_avx(auVar130,auVar130,3);
  auVar11 = vminps_avx(auVar11,auVar241);
  auVar130 = vmaxps_avx(auVar130,auVar155);
  auVar227._0_4_ = auVar11._0_4_ * fVar122;
  auVar227._4_4_ = auVar11._4_4_ * fVar122;
  auVar227._8_4_ = auVar11._8_4_ * fVar122;
  auVar227._12_4_ = auVar11._12_4_ * fVar122;
  auVar213._0_4_ = auVar130._0_4_ * fVar122;
  auVar213._4_4_ = auVar130._4_4_ * fVar122;
  auVar213._8_4_ = auVar130._8_4_ * fVar122;
  auVar213._12_4_ = auVar130._12_4_ * fVar122;
  fVar122 = 1.0 / (auVar89._0_4_ - auVar61._0_4_);
  auVar130 = vshufpd_avx(auVar62,auVar62,3);
  auVar11 = vshufpd_avx(auVar235,auVar235,3);
  auVar241 = vshufpd_avx(auVar108,auVar108,3);
  auVar155 = vshufpd_avx(auVar90,auVar90,3);
  auVar130 = vsubps_avx(auVar130,auVar62);
  auVar62 = vsubps_avx(auVar11,auVar235);
  auVar235 = vsubps_avx(auVar241,auVar108);
  auVar155 = vsubps_avx(auVar155,auVar90);
  auVar11 = vminps_avx(auVar130,auVar62);
  auVar130 = vmaxps_avx(auVar130,auVar62);
  auVar241 = vminps_avx(auVar235,auVar155);
  auVar241 = vminps_avx(auVar11,auVar241);
  auVar11 = vmaxps_avx(auVar235,auVar155);
  auVar130 = vmaxps_avx(auVar130,auVar11);
  auVar250._0_4_ = fVar122 * auVar241._0_4_;
  auVar250._4_4_ = fVar122 * auVar241._4_4_;
  auVar250._8_4_ = fVar122 * auVar241._8_4_;
  auVar250._12_4_ = fVar122 * auVar241._12_4_;
  auVar242._0_4_ = fVar122 * auVar130._0_4_;
  auVar242._4_4_ = fVar122 * auVar130._4_4_;
  auVar242._8_4_ = fVar122 * auVar130._8_4_;
  auVar242._12_4_ = fVar122 * auVar130._12_4_;
  auVar155 = vinsertps_avx(auVar10,auVar61,0x10);
  auVar62 = vinsertps_avx(auVar12,auVar89,0x10);
  auVar237._0_4_ = (auVar155._0_4_ + auVar62._0_4_) * 0.5;
  auVar237._4_4_ = (auVar155._4_4_ + auVar62._4_4_) * 0.5;
  auVar237._8_4_ = (auVar155._8_4_ + auVar62._8_4_) * 0.5;
  auVar237._12_4_ = (auVar155._12_4_ + auVar62._12_4_) * 0.5;
  auVar77._4_4_ = auVar237._0_4_;
  auVar77._0_4_ = auVar237._0_4_;
  auVar77._8_4_ = auVar237._0_4_;
  auVar77._12_4_ = auVar237._0_4_;
  auVar130 = vfmadd213ps_fma(local_1e8,auVar77,local_4d8);
  auVar11 = vfmadd213ps_fma(local_1f8,auVar77,local_4e8);
  auVar241 = vfmadd213ps_fma(local_208,auVar77,local_4f8);
  auVar12 = vsubps_avx(auVar11,auVar130);
  auVar130 = vfmadd213ps_fma(auVar12,auVar77,auVar130);
  auVar12 = vsubps_avx(auVar241,auVar11);
  auVar12 = vfmadd213ps_fma(auVar12,auVar77,auVar11);
  auVar12 = vsubps_avx(auVar12,auVar130);
  auVar130 = vfmadd231ps_fma(auVar130,auVar12,auVar77);
  auVar78._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
  auVar78._8_4_ = auVar12._8_4_ * 3.0;
  auVar78._12_4_ = auVar12._12_4_ * 3.0;
  auVar262._8_8_ = auVar130._0_8_;
  auVar262._0_8_ = auVar130._0_8_;
  auVar12 = vshufpd_avx(auVar130,auVar130,3);
  auVar130 = vshufps_avx(auVar237,auVar237,0x55);
  auVar90 = vsubps_avx(auVar12,auVar262);
  auVar127 = vfmadd231ps_fma(auVar262,auVar130,auVar90);
  auVar268._8_8_ = auVar78._0_8_;
  auVar268._0_8_ = auVar78._0_8_;
  auVar12 = vshufpd_avx(auVar78,auVar78,3);
  auVar12 = vsubps_avx(auVar12,auVar268);
  auVar108 = vfmadd213ps_fma(auVar12,auVar130,auVar268);
  auVar130 = vmovshdup_avx(auVar108);
  auVar269._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
  auVar269._8_4_ = auVar130._8_4_ ^ 0x80000000;
  auVar269._12_4_ = auVar130._12_4_ ^ 0x80000000;
  auVar11 = vmovshdup_avx(auVar90);
  auVar12 = vunpcklps_avx(auVar11,auVar269);
  auVar241 = vshufps_avx(auVar12,auVar269,4);
  auVar235 = vshufps_avx(auVar237,auVar237,0x54);
  auVar132._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
  auVar132._8_4_ = auVar90._8_4_ ^ 0x80000000;
  auVar132._12_4_ = auVar90._12_4_ ^ 0x80000000;
  auVar12 = vmovlhps_avx(auVar132,auVar108);
  auVar12 = vshufps_avx(auVar12,auVar108,8);
  auVar130 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar130._0_4_)),auVar11,auVar108);
  uVar57 = auVar130._0_4_;
  auVar79._4_4_ = uVar57;
  auVar79._0_4_ = uVar57;
  auVar79._8_4_ = uVar57;
  auVar79._12_4_ = uVar57;
  auVar130 = vdivps_avx(auVar241,auVar79);
  auVar11 = vdivps_avx(auVar12,auVar79);
  fVar87 = auVar127._0_4_;
  fVar122 = auVar130._0_4_;
  auVar12 = vshufps_avx(auVar127,auVar127,0x55);
  fVar86 = auVar11._0_4_;
  auVar80._0_4_ = fVar87 * fVar122 + auVar12._0_4_ * fVar86;
  auVar80._4_4_ = fVar87 * auVar130._4_4_ + auVar12._4_4_ * auVar11._4_4_;
  auVar80._8_4_ = fVar87 * auVar130._8_4_ + auVar12._8_4_ * auVar11._8_4_;
  auVar80._12_4_ = fVar87 * auVar130._12_4_ + auVar12._12_4_ * auVar11._12_4_;
  auVar136 = vsubps_avx(auVar235,auVar80);
  auVar235 = vmovshdup_avx(auVar130);
  auVar12 = vinsertps_avx(auVar227,auVar250,0x1c);
  auVar156._0_4_ = auVar235._0_4_ * auVar12._0_4_;
  auVar156._4_4_ = auVar235._4_4_ * auVar12._4_4_;
  auVar156._8_4_ = auVar235._8_4_ * auVar12._8_4_;
  auVar156._12_4_ = auVar235._12_4_ * auVar12._12_4_;
  auVar241 = vinsertps_avx(auVar213,auVar242,0x1c);
  auVar99._0_4_ = auVar241._0_4_ * auVar235._0_4_;
  auVar99._4_4_ = auVar241._4_4_ * auVar235._4_4_;
  auVar99._8_4_ = auVar241._8_4_ * auVar235._8_4_;
  auVar99._12_4_ = auVar241._12_4_ * auVar235._12_4_;
  auVar127 = vminps_avx(auVar156,auVar99);
  auVar108 = vmaxps_avx(auVar99,auVar156);
  auVar235 = vinsertps_avx(auVar250,auVar227,0x4c);
  auVar91 = vmovshdup_avx(auVar11);
  auVar90 = vinsertps_avx(auVar242,auVar213,0x4c);
  auVar243._0_4_ = auVar91._0_4_ * auVar235._0_4_;
  auVar243._4_4_ = auVar91._4_4_ * auVar235._4_4_;
  auVar243._8_4_ = auVar91._8_4_ * auVar235._8_4_;
  auVar243._12_4_ = auVar91._12_4_ * auVar235._12_4_;
  auVar228._0_4_ = auVar91._0_4_ * auVar90._0_4_;
  auVar228._4_4_ = auVar91._4_4_ * auVar90._4_4_;
  auVar228._8_4_ = auVar91._8_4_ * auVar90._8_4_;
  auVar228._12_4_ = auVar91._12_4_ * auVar90._12_4_;
  auVar91 = vminps_avx(auVar243,auVar228);
  auVar251._0_4_ = auVar127._0_4_ + auVar91._0_4_;
  auVar251._4_4_ = auVar127._4_4_ + auVar91._4_4_;
  auVar251._8_4_ = auVar127._8_4_ + auVar91._8_4_;
  auVar251._12_4_ = auVar127._12_4_ + auVar91._12_4_;
  auVar127 = vmaxps_avx(auVar228,auVar243);
  auVar100._0_4_ = auVar127._0_4_ + auVar108._0_4_;
  auVar100._4_4_ = auVar127._4_4_ + auVar108._4_4_;
  auVar100._8_4_ = auVar127._8_4_ + auVar108._8_4_;
  auVar100._12_4_ = auVar127._12_4_ + auVar108._12_4_;
  auVar229._8_8_ = 0x3f80000000000000;
  auVar229._0_8_ = 0x3f80000000000000;
  auVar108 = vsubps_avx(auVar229,auVar100);
  auVar127 = vsubps_avx(auVar229,auVar251);
  auVar91 = vsubps_avx(auVar155,auVar237);
  auVar123 = vsubps_avx(auVar62,auVar237);
  auVar115._0_4_ = fVar122 * auVar12._0_4_;
  auVar115._4_4_ = fVar122 * auVar12._4_4_;
  auVar115._8_4_ = fVar122 * auVar12._8_4_;
  auVar115._12_4_ = fVar122 * auVar12._12_4_;
  auVar252._0_4_ = fVar122 * auVar241._0_4_;
  auVar252._4_4_ = fVar122 * auVar241._4_4_;
  auVar252._8_4_ = fVar122 * auVar241._8_4_;
  auVar252._12_4_ = fVar122 * auVar241._12_4_;
  auVar241 = vminps_avx(auVar115,auVar252);
  auVar12 = vmaxps_avx(auVar252,auVar115);
  auVar157._0_4_ = fVar86 * auVar235._0_4_;
  auVar157._4_4_ = fVar86 * auVar235._4_4_;
  auVar157._8_4_ = fVar86 * auVar235._8_4_;
  auVar157._12_4_ = fVar86 * auVar235._12_4_;
  auVar214._0_4_ = fVar86 * auVar90._0_4_;
  auVar214._4_4_ = fVar86 * auVar90._4_4_;
  auVar214._8_4_ = fVar86 * auVar90._8_4_;
  auVar214._12_4_ = fVar86 * auVar90._12_4_;
  auVar235 = vminps_avx(auVar157,auVar214);
  auVar253._0_4_ = auVar241._0_4_ + auVar235._0_4_;
  auVar253._4_4_ = auVar241._4_4_ + auVar235._4_4_;
  auVar253._8_4_ = auVar241._8_4_ + auVar235._8_4_;
  auVar253._12_4_ = auVar241._12_4_ + auVar235._12_4_;
  fVar121 = auVar91._0_4_;
  auVar263._0_4_ = fVar121 * auVar108._0_4_;
  fVar182 = auVar91._4_4_;
  auVar263._4_4_ = fVar182 * auVar108._4_4_;
  fVar196 = auVar91._8_4_;
  auVar263._8_4_ = fVar196 * auVar108._8_4_;
  fVar197 = auVar91._12_4_;
  auVar263._12_4_ = fVar197 * auVar108._12_4_;
  auVar241 = vmaxps_avx(auVar214,auVar157);
  auVar215._0_4_ = fVar121 * auVar127._0_4_;
  auVar215._4_4_ = fVar182 * auVar127._4_4_;
  auVar215._8_4_ = fVar196 * auVar127._8_4_;
  auVar215._12_4_ = fVar197 * auVar127._12_4_;
  fVar87 = auVar123._0_4_;
  auVar101._0_4_ = fVar87 * auVar108._0_4_;
  fVar60 = auVar123._4_4_;
  auVar101._4_4_ = fVar60 * auVar108._4_4_;
  fVar148 = auVar123._8_4_;
  auVar101._8_4_ = fVar148 * auVar108._8_4_;
  fVar220 = auVar123._12_4_;
  auVar101._12_4_ = fVar220 * auVar108._12_4_;
  auVar230._0_4_ = fVar87 * auVar127._0_4_;
  auVar230._4_4_ = fVar60 * auVar127._4_4_;
  auVar230._8_4_ = fVar148 * auVar127._8_4_;
  auVar230._12_4_ = fVar220 * auVar127._12_4_;
  auVar116._0_4_ = auVar12._0_4_ + auVar241._0_4_;
  auVar116._4_4_ = auVar12._4_4_ + auVar241._4_4_;
  auVar116._8_4_ = auVar12._8_4_ + auVar241._8_4_;
  auVar116._12_4_ = auVar12._12_4_ + auVar241._12_4_;
  auVar158._8_8_ = 0x3f800000;
  auVar158._0_8_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar158,auVar116);
  auVar241 = vsubps_avx(auVar158,auVar253);
  auVar254._0_4_ = fVar121 * auVar12._0_4_;
  auVar254._4_4_ = fVar182 * auVar12._4_4_;
  auVar254._8_4_ = fVar196 * auVar12._8_4_;
  auVar254._12_4_ = fVar197 * auVar12._12_4_;
  auVar244._0_4_ = fVar121 * auVar241._0_4_;
  auVar244._4_4_ = fVar182 * auVar241._4_4_;
  auVar244._8_4_ = fVar196 * auVar241._8_4_;
  auVar244._12_4_ = fVar197 * auVar241._12_4_;
  auVar117._0_4_ = fVar87 * auVar12._0_4_;
  auVar117._4_4_ = fVar60 * auVar12._4_4_;
  auVar117._8_4_ = fVar148 * auVar12._8_4_;
  auVar117._12_4_ = fVar220 * auVar12._12_4_;
  auVar159._0_4_ = fVar87 * auVar241._0_4_;
  auVar159._4_4_ = fVar60 * auVar241._4_4_;
  auVar159._8_4_ = fVar148 * auVar241._8_4_;
  auVar159._12_4_ = fVar220 * auVar241._12_4_;
  auVar12 = vminps_avx(auVar254,auVar244);
  auVar241 = vminps_avx(auVar117,auVar159);
  auVar12 = vminps_avx(auVar12,auVar241);
  auVar241 = vmaxps_avx(auVar244,auVar254);
  auVar235 = vmaxps_avx(auVar159,auVar117);
  auVar90 = vminps_avx(auVar263,auVar215);
  auVar108 = vminps_avx(auVar101,auVar230);
  auVar90 = vminps_avx(auVar90,auVar108);
  auVar12 = vhaddps_avx(auVar12,auVar90);
  auVar241 = vmaxps_avx(auVar235,auVar241);
  auVar235 = vmaxps_avx(auVar215,auVar263);
  auVar90 = vmaxps_avx(auVar230,auVar101);
  auVar235 = vmaxps_avx(auVar90,auVar235);
  auVar241 = vhaddps_avx(auVar241,auVar235);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar241 = vshufps_avx(auVar241,auVar241,0xe8);
  auVar231._0_4_ = auVar136._0_4_ + auVar12._0_4_;
  auVar231._4_4_ = auVar136._4_4_ + auVar12._4_4_;
  auVar231._8_4_ = auVar136._8_4_ + auVar12._8_4_;
  auVar231._12_4_ = auVar136._12_4_ + auVar12._12_4_;
  auVar216._0_4_ = auVar136._0_4_ + auVar241._0_4_;
  auVar216._4_4_ = auVar136._4_4_ + auVar241._4_4_;
  auVar216._8_4_ = auVar136._8_4_ + auVar241._8_4_;
  auVar216._12_4_ = auVar136._12_4_ + auVar241._12_4_;
  auVar219 = ZEXT1664(auVar216);
  auVar12 = vmaxps_avx(auVar155,auVar231);
  auVar241 = vminps_avx(auVar216,auVar62);
  auVar12 = vcmpps_avx(auVar241,auVar12,1);
  auVar12 = vshufps_avx(auVar12,auVar12,0x50);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar12[0xf] < '\0')
  goto LAB_01183b59;
  bVar51 = 0;
  if ((auVar195._0_4_ < auVar231._0_4_) && (bVar51 = 0, auVar216._0_4_ < auVar62._0_4_)) {
    auVar241 = vmovshdup_avx(auVar231);
    auVar12 = vcmpps_avx(auVar216,auVar62,1);
    bVar51 = auVar12[4] & auVar61._0_4_ < auVar241._0_4_;
  }
  auVar219 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar53 || fVar59 < 0.001) | bVar51) != 1) goto LAB_01184939;
  lVar50 = 0xc9;
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_01183b59;
    fVar60 = auVar136._0_4_;
    fVar87 = 1.0 - fVar60;
    fVar59 = fVar87 * fVar87 * fVar87;
    fVar85 = fVar60 * 3.0 * fVar87 * fVar87;
    fVar87 = fVar87 * fVar60 * fVar60 * 3.0;
    auVar143._4_4_ = fVar59;
    auVar143._0_4_ = fVar59;
    auVar143._8_4_ = fVar59;
    auVar143._12_4_ = fVar59;
    auVar118._4_4_ = fVar85;
    auVar118._0_4_ = fVar85;
    auVar118._8_4_ = fVar85;
    auVar118._12_4_ = fVar85;
    auVar102._4_4_ = fVar87;
    auVar102._0_4_ = fVar87;
    auVar102._8_4_ = fVar87;
    auVar102._12_4_ = fVar87;
    fVar60 = fVar60 * fVar60 * fVar60;
    auVar160._0_4_ = (float)local_218._0_4_ * fVar60;
    auVar160._4_4_ = (float)local_218._4_4_ * fVar60;
    auVar160._8_4_ = fStack_210 * fVar60;
    auVar160._12_4_ = fStack_20c * fVar60;
    auVar10 = vfmadd231ps_fma(auVar160,local_4f8,auVar102);
    auVar10 = vfmadd231ps_fma(auVar10,local_4e8,auVar118);
    auVar10 = vfmadd231ps_fma(auVar10,local_4d8,auVar143);
    auVar103._8_8_ = auVar10._0_8_;
    auVar103._0_8_ = auVar10._0_8_;
    auVar10 = vshufpd_avx(auVar10,auVar10,3);
    auVar12 = vshufps_avx(auVar136,auVar136,0x55);
    auVar10 = vsubps_avx(auVar10,auVar103);
    auVar12 = vfmadd213ps_fma(auVar10,auVar12,auVar103);
    fVar59 = auVar12._0_4_;
    auVar10 = vshufps_avx(auVar12,auVar12,0x55);
    auVar104._0_4_ = fVar122 * fVar59 + fVar86 * auVar10._0_4_;
    auVar104._4_4_ = auVar130._4_4_ * fVar59 + auVar11._4_4_ * auVar10._4_4_;
    auVar104._8_4_ = auVar130._8_4_ * fVar59 + auVar11._8_4_ * auVar10._8_4_;
    auVar104._12_4_ = auVar130._12_4_ * fVar59 + auVar11._12_4_ * auVar10._12_4_;
    auVar136 = vsubps_avx(auVar136,auVar104);
    auVar10 = vandps_avx(local_318,auVar12);
    auVar12 = vshufps_avx(auVar10,auVar10,0xf5);
    auVar10 = vmaxss_avx(auVar12,auVar10);
  } while ((float)local_228._0_4_ <= auVar10._0_4_);
  fVar59 = auVar136._0_4_;
  if ((fVar59 < 0.0) || (1.0 < fVar59)) goto LAB_01183b59;
  auVar10 = vmovshdup_avx(auVar136);
  fVar85 = auVar10._0_4_;
  if ((fVar85 < 0.0) || (1.0 < fVar85)) goto LAB_01183b59;
  auVar10 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar235 = vinsertps_avx(auVar10,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->org).field_0;
  auVar10 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar10 = vdpps_avx(auVar10,auVar235,0x7f);
  auVar12 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar12 = vdpps_avx(auVar12,auVar235,0x7f);
  auVar130 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar130 = vdpps_avx(auVar130,auVar235,0x7f);
  auVar11 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar11 = vdpps_avx(auVar11,auVar235,0x7f);
  auVar241 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
  auVar241 = vdpps_avx(auVar241,auVar235,0x7f);
  auVar155 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar155 = vdpps_avx(auVar155,auVar235,0x7f);
  auVar62 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar62 = vdpps_avx(auVar62,auVar235,0x7f);
  auVar44._4_4_ = fStack_4b4;
  auVar44._0_4_ = local_4b8;
  auVar44._8_4_ = fStack_4b0;
  auVar44._12_4_ = fStack_4ac;
  auVar90 = vsubps_avx(auVar44,(undefined1  [16])aVar2);
  auVar235 = vdpps_avx(auVar90,auVar235,0x7f);
  fVar122 = 1.0 - fVar85;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar241._0_4_ * fVar85)),ZEXT416((uint)fVar122),auVar10)
  ;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar155._0_4_ * fVar85)),ZEXT416((uint)fVar122),auVar12)
  ;
  auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar85)),ZEXT416((uint)fVar122),auVar130
                            );
  auVar219 = ZEXT1664(auVar130);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * auVar235._0_4_)),ZEXT416((uint)fVar122),auVar11)
  ;
  fVar87 = 1.0 - fVar59;
  fVar85 = fVar87 * fVar59 * fVar59 * 3.0;
  fVar148 = fVar59 * fVar59 * fVar59;
  auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar148)),ZEXT416((uint)fVar85),auVar130
                            );
  fVar122 = fVar59 * 3.0 * fVar87 * fVar87;
  auVar12 = vfmadd231ss_fma(auVar130,ZEXT416((uint)fVar122),auVar12);
  fVar86 = fVar87 * fVar87 * fVar87;
  auVar10 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar86),auVar10);
  fVar60 = auVar10._0_4_;
  if ((fVar60 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar60)) goto LAB_01183b59;
  pGVar5 = (context->scene->geometries).items[local_4c0].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_011848de;
    local_518._0_4_ = ray->tfar;
    auVar10 = vshufps_avx(auVar136,auVar136,0x55);
    auVar203._8_4_ = 0x3f800000;
    auVar203._0_8_ = 0x3f8000003f800000;
    auVar203._12_4_ = 0x3f800000;
    auVar12 = vsubps_avx(auVar203,auVar10);
    fVar220 = auVar10._0_4_;
    auVar217._0_4_ = fVar220 * (float)local_458._0_4_;
    fVar121 = auVar10._4_4_;
    auVar217._4_4_ = fVar121 * (float)local_458._4_4_;
    fVar182 = auVar10._8_4_;
    auVar217._8_4_ = fVar182 * fStack_450;
    fVar196 = auVar10._12_4_;
    auVar217._12_4_ = fVar196 * fStack_44c;
    auVar232._0_4_ = fVar220 * (float)local_498._0_4_;
    auVar232._4_4_ = fVar121 * (float)local_498._4_4_;
    auVar232._8_4_ = fVar182 * fStack_490;
    auVar232._12_4_ = fVar196 * fStack_48c;
    auVar238._0_4_ = fVar220 * (float)local_4a8._0_4_;
    auVar238._4_4_ = fVar121 * (float)local_4a8._4_4_;
    auVar238._8_4_ = fVar182 * fStack_4a0;
    auVar238._12_4_ = fVar196 * fStack_49c;
    auVar190._0_4_ = fVar220 * local_4b8;
    auVar190._4_4_ = fVar121 * fStack_4b4;
    auVar190._8_4_ = fVar182 * fStack_4b0;
    auVar190._12_4_ = fVar196 * fStack_4ac;
    auVar10 = vfmadd231ps_fma(auVar217,auVar12,local_448);
    auVar130 = vfmadd231ps_fma(auVar232,auVar12,local_478);
    auVar11 = vfmadd231ps_fma(auVar238,auVar12,local_488);
    auVar241 = vfmadd231ps_fma(auVar190,auVar12,local_468);
    auVar10 = vsubps_avx(auVar130,auVar10);
    auVar12 = vsubps_avx(auVar11,auVar130);
    auVar219 = ZEXT1664(auVar12);
    auVar130 = vsubps_avx(auVar241,auVar11);
    auVar239._0_4_ = fVar59 * auVar12._0_4_;
    auVar239._4_4_ = fVar59 * auVar12._4_4_;
    auVar239._8_4_ = fVar59 * auVar12._8_4_;
    auVar239._12_4_ = fVar59 * auVar12._12_4_;
    auVar180._4_4_ = fVar87;
    auVar180._0_4_ = fVar87;
    auVar180._8_4_ = fVar87;
    auVar180._12_4_ = fVar87;
    auVar10 = vfmadd231ps_fma(auVar239,auVar180,auVar10);
    auVar191._0_4_ = fVar59 * auVar130._0_4_;
    auVar191._4_4_ = fVar59 * auVar130._4_4_;
    auVar191._8_4_ = fVar59 * auVar130._8_4_;
    auVar191._12_4_ = fVar59 * auVar130._12_4_;
    auVar130 = vfmadd231ps_fma(auVar191,auVar180,auVar12);
    auVar192._0_4_ = fVar59 * auVar130._0_4_;
    auVar192._4_4_ = fVar59 * auVar130._4_4_;
    auVar192._8_4_ = fVar59 * auVar130._8_4_;
    auVar192._12_4_ = fVar59 * auVar130._12_4_;
    auVar130 = vfmadd231ps_fma(auVar192,auVar180,auVar10);
    auVar161._0_4_ = fVar148 * (float)local_288._0_4_;
    auVar161._4_4_ = fVar148 * (float)local_288._4_4_;
    auVar161._8_4_ = fVar148 * fStack_280;
    auVar161._12_4_ = fVar148 * fStack_27c;
    auVar119._4_4_ = fVar85;
    auVar119._0_4_ = fVar85;
    auVar119._8_4_ = fVar85;
    auVar119._12_4_ = fVar85;
    auVar10 = vfmadd132ps_fma(auVar119,auVar161,local_278);
    auVar144._4_4_ = fVar122;
    auVar144._0_4_ = fVar122;
    auVar144._8_4_ = fVar122;
    auVar144._12_4_ = fVar122;
    auVar10 = vfmadd132ps_fma(auVar144,auVar10,local_268);
    auVar120._0_4_ = auVar130._0_4_ * 3.0;
    auVar120._4_4_ = auVar130._4_4_ * 3.0;
    auVar120._8_4_ = auVar130._8_4_ * 3.0;
    auVar120._12_4_ = auVar130._12_4_ * 3.0;
    auVar133._4_4_ = fVar86;
    auVar133._0_4_ = fVar86;
    auVar133._8_4_ = fVar86;
    auVar133._12_4_ = fVar86;
    auVar130 = vfmadd132ps_fma(auVar133,auVar10,local_258);
    auVar10 = vshufps_avx(auVar120,auVar120,0xc9);
    auVar145._0_4_ = auVar130._0_4_ * auVar10._0_4_;
    auVar145._4_4_ = auVar130._4_4_ * auVar10._4_4_;
    auVar145._8_4_ = auVar130._8_4_ * auVar10._8_4_;
    auVar145._12_4_ = auVar130._12_4_ * auVar10._12_4_;
    auVar10 = vshufps_avx(auVar130,auVar130,0xc9);
    auVar130 = vfmsub231ps_fma(auVar145,auVar120,auVar10);
    auVar10 = vshufps_avx(auVar130,auVar130,0xe9);
    local_2d8 = vmovlps_avx(auVar10);
    local_2d0 = auVar130._0_4_;
    local_2cc = vmovlps_avx(auVar136);
    local_2c4 = (int)local_398;
    local_2c0 = (int)local_4c0;
    local_2bc = context->user->instID[0];
    local_2b8 = context->user->instPrimID[0];
    ray->tfar = fVar60;
    local_51c = -1;
    local_348.valid = &local_51c;
    local_348.geometryUserPtr = pGVar5->userPtr;
    local_348.context = context->user;
    local_348.hit = (RTCHitN *)&local_2d8;
    local_348.N = 1;
    local_348.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01184887:
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        auVar219 = ZEXT1664(auVar219._0_16_);
        (*p_Var6)(&local_348);
        if (*local_348.valid == 0) goto LAB_011848d0;
      }
      bVar51 = 1;
      goto LAB_011848de;
    }
    auVar219 = ZEXT1664(auVar12);
    (*pGVar5->occlusionFilterN)(&local_348);
    if (*local_348.valid != 0) goto LAB_01184887;
LAB_011848d0:
    ray->tfar = (float)local_518._0_4_;
  }
  bVar51 = 0;
LAB_011848de:
  bVar58 = (bool)(bVar58 | bVar51);
  goto LAB_01183b59;
LAB_01184939:
  local_238 = vinsertps_avx(auVar10,ZEXT416((uint)fVar85),0x10);
  auVar69 = vinsertps_avx(auVar61,ZEXT416((uint)auVar89._0_4_),0x10);
  goto LAB_011835aa;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }